

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::sse2::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Scene **ppSVar5;
  Scene **ppSVar6;
  Scene **ppSVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined4 uVar19;
  Primitive PVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  Geometry *pGVar27;
  __int_type_conflict _Var28;
  long lVar29;
  long lVar30;
  RTCFilterFunctionN p_Var31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  unkbyte9 Var88;
  undefined1 auVar89 [13];
  undefined1 auVar90 [12];
  undefined1 auVar91 [13];
  undefined1 auVar92 [12];
  undefined1 auVar93 [13];
  undefined1 auVar94 [12];
  undefined1 auVar95 [13];
  undefined1 auVar96 [12];
  undefined1 auVar97 [12];
  undefined6 uVar98;
  undefined1 auVar99 [12];
  undefined1 auVar100 [12];
  undefined1 auVar101 [13];
  undefined1 auVar102 [12];
  undefined1 auVar103 [12];
  undefined1 auVar104 [12];
  undefined1 auVar105 [12];
  undefined1 auVar106 [12];
  undefined1 auVar107 [12];
  undefined1 auVar108 [12];
  undefined1 auVar109 [12];
  undefined1 auVar110 [12];
  undefined1 auVar111 [12];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [15];
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [15];
  undefined1 auVar125 [15];
  undefined1 auVar126 [13];
  undefined1 auVar127 [13];
  undefined1 auVar128 [15];
  undefined1 auVar129 [15];
  undefined4 uVar130;
  ulong uVar132;
  StackEntry *pSVar133;
  long extraout_RAX;
  undefined4 uVar131;
  RTCRayN *pRVar134;
  long extraout_RAX_00;
  long lVar135;
  RTCIntersectArguments *pRVar136;
  RTCIntersectArguments *pRVar137;
  ulong uVar138;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong uVar139;
  ulong uVar140;
  byte bVar141;
  bool bVar142;
  uint uVar143;
  uint uVar144;
  uint uVar145;
  uint uVar146;
  uint uVar147;
  char cVar148;
  short sVar149;
  float fVar150;
  float fVar151;
  char cVar198;
  undefined2 uVar200;
  undefined1 auVar152 [12];
  undefined1 uVar199;
  float fVar203;
  __m128 a_1;
  char cVar205;
  undefined1 auVar154 [16];
  undefined1 auVar153 [12];
  undefined1 auVar158 [16];
  float fVar206;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar166 [16];
  undefined1 auVar169 [16];
  undefined1 auVar172 [16];
  undefined1 auVar175 [16];
  float fVar207;
  float fVar209;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar204;
  float fVar208;
  float fVar210;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar197;
  float pp;
  int iVar211;
  int iVar212;
  int iVar213;
  float fVar214;
  int iVar259;
  undefined1 auVar215 [12];
  undefined1 auVar220 [16];
  undefined1 auVar224 [16];
  undefined1 auVar228 [16];
  undefined1 auVar232 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar275;
  float fVar280;
  vfloat4 a;
  undefined1 auVar266 [16];
  float fVar276;
  float fVar277;
  float fVar281;
  float fVar284;
  undefined1 auVar269 [16];
  float fVar278;
  float fVar279;
  float fVar282;
  float fVar283;
  float fVar285;
  float fVar286;
  undefined1 auVar270 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar271;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  char cVar305;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar306;
  float fVar308;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  float fVar307;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar314;
  float fVar315;
  float fVar316;
  undefined1 auVar317 [12];
  float fVar336;
  float fVar338;
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar318 [12];
  undefined1 auVar324 [16];
  undefined1 auVar328 [16];
  float fVar337;
  float fVar339;
  float fVar340;
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  float fVar341;
  float fVar350;
  float fVar352;
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  float fVar351;
  float fVar353;
  float fVar354;
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  uint uVar355;
  float fVar364;
  uint uVar365;
  uint uVar366;
  uint uVar367;
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar363 [16];
  float fVar371;
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  float fVar372;
  float fVar373;
  float fVar385;
  undefined1 auVar374 [12];
  undefined1 auVar375 [16];
  undefined1 auVar379 [16];
  float fVar386;
  float fVar388;
  float fVar389;
  float fVar391;
  float fVar392;
  undefined1 auVar380 [16];
  float fVar387;
  float fVar390;
  float fVar393;
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  float fVar394;
  undefined1 auVar395 [12];
  undefined2 uVar411;
  float fVar412;
  undefined2 uVar414;
  undefined1 auVar396 [16];
  undefined1 auVar399 [16];
  undefined1 auVar403 [16];
  float fVar413;
  float fVar415;
  float fVar416;
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar408;
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  float fVar417;
  float fVar426;
  float fVar427;
  undefined1 auVar418 [16];
  undefined1 auVar421 [16];
  float fVar428;
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar425 [16];
  float fVar429;
  float fVar430;
  float fVar431;
  float fVar442;
  float fVar445;
  undefined1 auVar432 [16];
  undefined1 auVar435 [16];
  undefined1 auVar438 [16];
  float fVar443;
  float fVar444;
  float fVar446;
  float fVar447;
  float fVar448;
  float fVar449;
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  float fVar450;
  float fVar451;
  float fVar452;
  float fVar453;
  float fVar463;
  float fVar464;
  float fVar467;
  float fVar468;
  float fVar471;
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar459 [16];
  float fVar465;
  float fVar466;
  float fVar469;
  float fVar470;
  float fVar472;
  float fVar473;
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  float fVar474;
  float fVar475;
  float fVar476;
  float fVar477;
  float fVar478;
  float fVar479;
  float fVar480;
  float fVar481;
  float fVar482;
  float fVar483;
  float fVar484;
  float fVar485;
  float fVar488;
  float fVar489;
  float fVar490;
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 local_6a8 [8];
  float fStack_6a0;
  float fStack_69c;
  Vec3fa dir;
  undefined8 local_668;
  undefined1 local_648 [8];
  float fStack_640;
  float fStack_63c;
  undefined1 local_618 [8];
  float fStack_610;
  float fStack_60c;
  undefined1 local_5d8 [8];
  float fStack_5d0;
  float fStack_5cc;
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [8];
  float fStack_5b0;
  float fStack_5ac;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  RTCFilterFunctionNArguments args;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined4 local_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  uint local_2a8;
  uint uStack_2a4;
  uint uStack_2a0;
  uint uStack_29c;
  uint local_298;
  uint uStack_294;
  uint uStack_290;
  uint uStack_28c;
  BBox<embree::vfloat_impl<4>_> tp1;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  BBox<embree::vfloat_impl<4>_> tp0;
  float local_118 [4];
  float local_108 [4];
  StackEntry stack [4];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar155 [16];
  undefined1 auVar159 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar160 [16];
  int iVar201;
  int iVar202;
  undefined1 auVar216 [12];
  undefined1 auVar217 [12];
  undefined1 auVar218 [12];
  undefined1 auVar221 [16];
  undefined1 auVar225 [16];
  undefined1 auVar229 [16];
  undefined1 auVar233 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar234 [16];
  undefined1 auVar264 [12];
  undefined1 auVar267 [16];
  undefined1 auVar265 [16];
  undefined1 auVar268 [16];
  undefined1 auVar321 [16];
  undefined1 auVar325 [16];
  undefined1 auVar333 [16];
  undefined1 auVar322 [16];
  undefined1 auVar326 [16];
  undefined1 auVar323 [16];
  undefined1 auVar327 [16];
  undefined1 auVar362 [16];
  undefined1 auVar370 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  float fVar384;
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar424 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  
  PVar20 = prim[1];
  uVar132 = (ulong)(byte)PVar20;
  lVar135 = uVar132 * 0x25;
  uVar131 = *(undefined4 *)(prim + uVar132 * 4 + 6);
  uVar21 = *(undefined4 *)(prim + uVar132 * 5 + 6);
  uVar22 = *(undefined4 *)(prim + uVar132 * 6 + 6);
  uVar23 = *(undefined4 *)(prim + uVar132 * 0xf + 6);
  uVar24 = *(undefined4 *)(prim + (ulong)(byte)PVar20 * 0x10 + 6);
  uVar25 = *(undefined4 *)(prim + uVar132 * 0x11 + 6);
  uVar130 = *(undefined4 *)(prim + uVar132 * 0x1a + 6);
  uVar26 = *(undefined4 *)(prim + uVar132 * 0x1b + 6);
  auVar356 = *(undefined1 (*) [16])(prim + lVar135 + 6);
  auVar219._12_4_ = auVar356._12_4_;
  auVar215._0_8_ = CONCAT44(auVar219._12_4_,auVar219._12_4_);
  auVar215._8_4_ = auVar219._12_4_;
  auVar219._0_12_ = auVar215;
  fVar314 = (*(float *)(ray + k * 4) - auVar356._0_4_) * auVar219._12_4_;
  fVar336 = (*(float *)(ray + k * 4 + 0x10) - auVar356._4_4_) * auVar219._12_4_;
  fVar338 = (*(float *)(ray + k * 4 + 0x20) - auVar356._8_4_) * auVar219._12_4_;
  fVar450 = *(float *)(ray + k * 4 + 0x40) * auVar219._12_4_;
  fVar463 = *(float *)(ray + k * 4 + 0x50) * auVar219._12_4_;
  fVar467 = *(float *)(ray + k * 4 + 0x60) * auVar219._12_4_;
  auVar36[0xd] = 0;
  auVar36._0_13_ = auVar219._0_13_;
  auVar36[0xe] = auVar356[0xf];
  auVar41[0xc] = auVar356[0xe];
  auVar41._0_12_ = auVar215;
  auVar41._13_2_ = auVar36._13_2_;
  auVar46[0xb] = 0;
  auVar46._0_11_ = auVar215._0_11_;
  auVar46._12_3_ = auVar41._12_3_;
  auVar51[10] = auVar356[0xd];
  auVar51._0_10_ = auVar215._0_10_;
  auVar51._11_4_ = auVar46._11_4_;
  auVar56[9] = 0;
  auVar56._0_9_ = auVar215._0_9_;
  auVar56._10_5_ = auVar51._10_5_;
  auVar61[8] = auVar356[0xc];
  auVar61._0_8_ = auVar215._0_8_;
  auVar61._9_6_ = auVar56._9_6_;
  Var88 = CONCAT81(CONCAT71(auVar61._8_7_,(char)((uint)uVar21 >> 0x18)),auVar356[0xf]);
  auVar66._6_9_ = Var88;
  auVar66[5] = (char)((uint)uVar21 >> 0x10);
  auVar66[4] = auVar356[0xe];
  auVar66._0_4_ = auVar219._12_4_;
  cVar205 = (char)((uint)uVar21 >> 8);
  auVar89._2_11_ = auVar66._4_11_;
  auVar89[1] = cVar205;
  auVar89[0] = auVar356[0xd];
  cVar198 = (char)uVar21;
  sVar149 = CONCAT11(cVar198,auVar356[0xc]);
  auVar71._2_13_ = auVar89;
  auVar71._0_2_ = sVar149;
  uVar200 = (undefined2)Var88;
  auVar222._0_12_ = auVar71._0_12_;
  auVar222._12_2_ = uVar200;
  auVar222._14_2_ = uVar200;
  auVar221._12_4_ = auVar222._12_4_;
  auVar221._0_10_ = auVar71._0_10_;
  auVar221._10_2_ = auVar66._4_2_;
  auVar220._10_6_ = auVar221._10_6_;
  auVar220._0_8_ = auVar71._0_8_;
  auVar220._8_2_ = auVar66._4_2_;
  auVar90._4_8_ = auVar220._8_8_;
  auVar90._2_2_ = auVar89._0_2_;
  auVar90._0_2_ = auVar89._0_2_;
  iVar211 = (int)sVar149 >> 8;
  iVar259 = auVar90._0_4_ >> 0x18;
  auVar216._0_8_ = CONCAT44(iVar259,iVar211);
  auVar216._8_4_ = auVar220._8_4_ >> 0x18;
  auVar223._12_4_ = auVar221._12_4_ >> 0x18;
  auVar223._0_12_ = auVar216;
  fVar364 = (float)iVar259;
  cVar148 = cVar205 >> 7;
  auVar37[0xd] = 0;
  auVar37._0_13_ = auVar223._0_13_;
  auVar37[0xe] = cVar148;
  auVar42[0xc] = cVar148;
  auVar42._0_12_ = auVar216;
  auVar42._13_2_ = auVar37._13_2_;
  auVar47[0xb] = 0;
  auVar47._0_11_ = auVar216._0_11_;
  auVar47._12_3_ = auVar42._12_3_;
  auVar52[10] = cVar148;
  auVar52._0_10_ = auVar216._0_10_;
  auVar52._11_4_ = auVar47._11_4_;
  auVar57[9] = 0;
  auVar57._0_9_ = auVar216._0_9_;
  auVar57._10_5_ = auVar52._10_5_;
  auVar62[8] = cVar205;
  auVar62._0_8_ = auVar216._0_8_;
  auVar62._9_6_ = auVar57._9_6_;
  Var88 = CONCAT81(CONCAT71(auVar62._8_7_,(char)((uint)uVar22 >> 0x18)),(short)cVar198 >> 7);
  auVar67._6_9_ = Var88;
  auVar67[5] = (char)((uint)uVar22 >> 0x10);
  auVar67[4] = (undefined1)((short)cVar198 >> 7);
  auVar67._0_4_ = iVar211;
  cVar305 = (char)((uint)uVar22 >> 8);
  auVar91._2_11_ = auVar67._4_11_;
  auVar91[1] = cVar305;
  auVar91[0] = (undefined1)((short)cVar198 >> 7);
  cVar205 = (char)uVar22;
  auVar72._2_13_ = auVar91;
  auVar72._0_2_ = CONCAT11(cVar205,cVar198);
  uVar200 = (undefined2)Var88;
  auVar226._0_12_ = auVar72._0_12_;
  auVar226._12_2_ = uVar200;
  auVar226._14_2_ = uVar200;
  auVar225._12_4_ = auVar226._12_4_;
  auVar225._0_10_ = auVar72._0_10_;
  auVar225._10_2_ = auVar67._4_2_;
  auVar224._10_6_ = auVar225._10_6_;
  auVar224._0_8_ = auVar72._0_8_;
  auVar224._8_2_ = auVar67._4_2_;
  auVar92._4_8_ = auVar224._8_8_;
  auVar92._2_2_ = auVar91._0_2_;
  auVar92._0_2_ = auVar91._0_2_;
  iVar212 = (int)CONCAT11(cVar205,cVar198) >> 8;
  iVar259 = auVar92._0_4_ >> 0x18;
  auVar217._0_8_ = CONCAT44(iVar259,iVar212);
  auVar217._8_4_ = auVar224._8_4_ >> 0x18;
  auVar227._12_4_ = auVar225._12_4_ >> 0x18;
  auVar227._0_12_ = auVar217;
  fVar478 = (float)iVar259;
  cVar148 = cVar305 >> 7;
  auVar38[0xd] = 0;
  auVar38._0_13_ = auVar227._0_13_;
  auVar38[0xe] = cVar148;
  auVar43[0xc] = cVar148;
  auVar43._0_12_ = auVar217;
  auVar43._13_2_ = auVar38._13_2_;
  auVar48[0xb] = 0;
  auVar48._0_11_ = auVar217._0_11_;
  auVar48._12_3_ = auVar43._12_3_;
  auVar53[10] = cVar148;
  auVar53._0_10_ = auVar217._0_10_;
  auVar53._11_4_ = auVar48._11_4_;
  auVar58[9] = 0;
  auVar58._0_9_ = auVar217._0_9_;
  auVar58._10_5_ = auVar53._10_5_;
  auVar63[8] = cVar305;
  auVar63._0_8_ = auVar217._0_8_;
  auVar63._9_6_ = auVar58._9_6_;
  Var88 = CONCAT81(CONCAT71(auVar63._8_7_,(char)((uint)uVar24 >> 0x18)),(short)cVar205 >> 7);
  auVar68._6_9_ = Var88;
  auVar68[5] = (char)((uint)uVar24 >> 0x10);
  auVar68[4] = (undefined1)((short)cVar205 >> 7);
  auVar68._0_4_ = iVar212;
  cVar305 = (char)((uint)uVar24 >> 8);
  auVar93._2_11_ = auVar68._4_11_;
  auVar93[1] = cVar305;
  auVar93[0] = (undefined1)((short)cVar205 >> 7);
  cVar198 = (char)uVar24;
  auVar73._2_13_ = auVar93;
  auVar73._0_2_ = CONCAT11(cVar198,cVar205);
  uVar200 = (undefined2)Var88;
  auVar230._0_12_ = auVar73._0_12_;
  auVar230._12_2_ = uVar200;
  auVar230._14_2_ = uVar200;
  auVar229._12_4_ = auVar230._12_4_;
  auVar229._0_10_ = auVar73._0_10_;
  auVar229._10_2_ = auVar68._4_2_;
  auVar228._10_6_ = auVar229._10_6_;
  auVar228._0_8_ = auVar73._0_8_;
  auVar228._8_2_ = auVar68._4_2_;
  auVar94._4_8_ = auVar228._8_8_;
  auVar94._2_2_ = auVar93._0_2_;
  auVar94._0_2_ = auVar93._0_2_;
  iVar213 = (int)CONCAT11(cVar198,cVar205) >> 8;
  iVar259 = auVar94._0_4_ >> 0x18;
  auVar218._0_8_ = CONCAT44(iVar259,iVar213);
  auVar218._8_4_ = auVar228._8_4_ >> 0x18;
  auVar231._12_4_ = auVar229._12_4_ >> 0x18;
  auVar231._0_12_ = auVar218;
  fVar371 = (float)iVar259;
  cVar148 = cVar305 >> 7;
  auVar39[0xd] = 0;
  auVar39._0_13_ = auVar231._0_13_;
  auVar39[0xe] = cVar148;
  auVar44[0xc] = cVar148;
  auVar44._0_12_ = auVar218;
  auVar44._13_2_ = auVar39._13_2_;
  auVar49[0xb] = 0;
  auVar49._0_11_ = auVar218._0_11_;
  auVar49._12_3_ = auVar44._12_3_;
  auVar54[10] = cVar148;
  auVar54._0_10_ = auVar218._0_10_;
  auVar54._11_4_ = auVar49._11_4_;
  auVar59[9] = 0;
  auVar59._0_9_ = auVar218._0_9_;
  auVar59._10_5_ = auVar54._10_5_;
  auVar64[8] = cVar305;
  auVar64._0_8_ = auVar218._0_8_;
  auVar64._9_6_ = auVar59._9_6_;
  Var88 = CONCAT81(CONCAT71(auVar64._8_7_,(char)((uint)uVar25 >> 0x18)),(short)cVar198 >> 7);
  auVar69._6_9_ = Var88;
  auVar69[5] = (char)((uint)uVar25 >> 0x10);
  auVar69[4] = (undefined1)((short)cVar198 >> 7);
  auVar69._0_4_ = iVar213;
  auVar95._2_11_ = auVar69._4_11_;
  auVar95[1] = (char)((uint)uVar25 >> 8);
  auVar95[0] = (undefined1)((short)cVar198 >> 7);
  sVar149 = CONCAT11((char)uVar25,cVar198);
  auVar74._2_13_ = auVar95;
  auVar74._0_2_ = sVar149;
  uVar200 = (undefined2)Var88;
  auVar234._0_12_ = auVar74._0_12_;
  auVar234._12_2_ = uVar200;
  auVar234._14_2_ = uVar200;
  auVar233._12_4_ = auVar234._12_4_;
  auVar233._0_10_ = auVar74._0_10_;
  auVar233._10_2_ = auVar69._4_2_;
  auVar232._10_6_ = auVar233._10_6_;
  auVar232._0_8_ = auVar74._0_8_;
  auVar232._8_2_ = auVar69._4_2_;
  auVar96._4_8_ = auVar232._8_8_;
  auVar96._2_2_ = auVar95._0_2_;
  auVar96._0_2_ = auVar95._0_2_;
  local_568 = (float)((int)sVar149 >> 8);
  fStack_564 = (float)(auVar96._0_4_ >> 0x18);
  fStack_560 = (float)(auVar232._8_4_ >> 0x18);
  fStack_55c = (float)(auVar233._12_4_ >> 0x18);
  uVar21 = *(undefined4 *)(prim + uVar132 * 0x1c + 6);
  fVar260 = fVar467 * (float)iVar212;
  fVar275 = fVar467 * fVar478;
  auVar264._0_8_ = CONCAT44(fVar275,fVar260);
  auVar264._8_4_ = fVar467 * (float)auVar217._8_4_;
  auVar265._12_4_ = fVar467 * (float)auVar227._12_4_;
  auVar265._0_12_ = auVar264;
  fVar287 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar135 + 0x16)) *
            *(float *)(prim + lVar135 + 0x1a);
  dir.field_0._0_1_ = (undefined1)uVar131;
  dir.field_0._1_1_ = (undefined1)((uint)uVar131 >> 8);
  dir.field_0._2_1_ = (undefined1)((uint)uVar131 >> 0x10);
  dir.field_0._3_1_ = (undefined1)((uint)uVar131 >> 0x18);
  auVar112[0xd] = 0;
  auVar112._0_13_ = auVar265._0_13_;
  auVar112[0xe] = (char)((uint)fVar275 >> 0x18);
  auVar114[0xc] = (char)((uint)fVar275 >> 0x10);
  auVar114._0_12_ = auVar264;
  auVar114._13_2_ = auVar112._13_2_;
  auVar116[0xb] = 0;
  auVar116._0_11_ = auVar264._0_11_;
  auVar116._12_3_ = auVar114._12_3_;
  auVar118[10] = (char)((uint)fVar275 >> 8);
  auVar118._0_10_ = auVar264._0_10_;
  auVar118._11_4_ = auVar116._11_4_;
  auVar120[9] = 0;
  auVar120._0_9_ = auVar264._0_9_;
  auVar120._10_5_ = auVar118._10_5_;
  auVar122[8] = SUB41(fVar275,0);
  auVar122._0_8_ = auVar264._0_8_;
  auVar122._9_6_ = auVar120._9_6_;
  Var88 = CONCAT81(CONCAT71(auVar122._8_7_,dir.field_0._3_1_),(char)((uint)fVar260 >> 0x18));
  auVar124._6_9_ = Var88;
  auVar124[5] = dir.field_0._2_1_;
  auVar124[4] = (char)((uint)fVar260 >> 0x10);
  auVar124._0_4_ = fVar260;
  auVar126._2_11_ = auVar124._4_11_;
  auVar126[1] = dir.field_0._1_1_;
  auVar126[0] = (char)((uint)fVar260 >> 8);
  sVar149 = CONCAT11(dir.field_0._0_1_,SUB41(fVar260,0));
  auVar128._2_13_ = auVar126;
  auVar128._0_2_ = sVar149;
  uVar200 = (undefined2)Var88;
  auVar268._0_12_ = auVar128._0_12_;
  auVar268._12_2_ = uVar200;
  auVar268._14_2_ = uVar200;
  auVar267._12_4_ = auVar268._12_4_;
  auVar267._0_10_ = auVar128._0_10_;
  auVar267._10_2_ = auVar124._4_2_;
  auVar266._10_6_ = auVar267._10_6_;
  auVar266._0_8_ = auVar128._0_8_;
  auVar266._8_2_ = auVar124._4_2_;
  auVar97._4_8_ = auVar266._8_8_;
  auVar97._2_2_ = auVar126._0_2_;
  auVar97._0_2_ = auVar126._0_2_;
  fVar261 = (float)((int)sVar149 >> 8);
  fVar276 = (float)(auVar97._0_4_ >> 0x18);
  fVar280 = (float)(auVar266._8_4_ >> 0x18);
  uVar199 = (undefined1)((uint)uVar23 >> 0x18);
  uVar200 = CONCAT11(uVar199,uVar199);
  uVar199 = (undefined1)((uint)uVar23 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar200,uVar199),CONCAT14(uVar199,uVar23));
  cVar198 = (char)((uint)uVar23 >> 8);
  uVar98 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),cVar198),cVar198);
  cVar148 = (char)uVar23;
  uVar139 = CONCAT62(uVar98,CONCAT11(cVar148,cVar148));
  auVar356._8_4_ = 0;
  auVar356._0_8_ = uVar139;
  auVar356._12_2_ = uVar200;
  auVar356._14_2_ = uVar200;
  uVar200 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar291._12_4_ = auVar356._12_4_;
  auVar291._8_2_ = 0;
  auVar291._0_8_ = uVar139;
  auVar291._10_2_ = uVar200;
  auVar405._10_6_ = auVar291._10_6_;
  auVar405._8_2_ = uVar200;
  auVar405._0_8_ = uVar139;
  uVar200 = (undefined2)uVar98;
  auVar99._4_8_ = auVar405._8_8_;
  auVar99._2_2_ = uVar200;
  auVar99._0_2_ = uVar200;
  iVar259 = (int)CONCAT11(cVar148,cVar148) >> 8;
  iVar201 = auVar99._0_4_ >> 0x18;
  auVar152._0_8_ = CONCAT44(iVar201,iVar259);
  auVar152._8_4_ = auVar405._8_4_ >> 0x18;
  auVar406._12_4_ = auVar291._12_4_ >> 0x18;
  auVar406._0_12_ = auVar152;
  fVar412 = (float)iVar201;
  local_6a8[0] = (char)uVar130;
  local_6a8[1] = (char)((uint)uVar130 >> 8);
  local_6a8[2] = (undefined1)((uint)uVar130 >> 0x10);
  local_6a8[3] = (undefined1)((uint)uVar130 >> 0x18);
  cVar205 = cVar198 >> 7;
  auVar113[0xd] = 0;
  auVar113._0_13_ = auVar406._0_13_;
  auVar113[0xe] = cVar205;
  auVar115[0xc] = cVar205;
  auVar115._0_12_ = auVar152;
  auVar115._13_2_ = auVar113._13_2_;
  auVar117[0xb] = 0;
  auVar117._0_11_ = auVar152._0_11_;
  auVar117._12_3_ = auVar115._12_3_;
  auVar119[10] = cVar205;
  auVar119._0_10_ = auVar152._0_10_;
  auVar119._11_4_ = auVar117._11_4_;
  auVar121[9] = 0;
  auVar121._0_9_ = auVar152._0_9_;
  auVar121._10_5_ = auVar119._10_5_;
  auVar123[8] = cVar198;
  auVar123._0_8_ = auVar152._0_8_;
  auVar123._9_6_ = auVar121._9_6_;
  Var88 = CONCAT81(CONCAT71(auVar123._8_7_,local_6a8[3]),(short)cVar148 >> 7);
  auVar125._6_9_ = Var88;
  auVar125[5] = local_6a8[2];
  auVar125[4] = (undefined1)((short)cVar148 >> 7);
  auVar125._0_4_ = iVar259;
  auVar127._2_11_ = auVar125._4_11_;
  auVar127[1] = local_6a8[1];
  auVar127[0] = (undefined1)((short)cVar148 >> 7);
  auVar129._2_13_ = auVar127;
  auVar129._0_2_ = CONCAT11(local_6a8[0],cVar148);
  uVar200 = (undefined2)Var88;
  auVar156._0_12_ = auVar129._0_12_;
  auVar156._12_2_ = uVar200;
  auVar156._14_2_ = uVar200;
  auVar155._12_4_ = auVar156._12_4_;
  auVar155._0_10_ = auVar129._0_10_;
  auVar155._10_2_ = auVar125._4_2_;
  auVar154._10_6_ = auVar155._10_6_;
  auVar154._0_8_ = auVar129._0_8_;
  auVar154._8_2_ = auVar125._4_2_;
  auVar100._4_8_ = auVar154._8_8_;
  auVar100._2_2_ = auVar127._0_2_;
  auVar100._0_2_ = auVar127._0_2_;
  iVar201 = (int)CONCAT11(local_6a8[0],cVar148) >> 8;
  iVar202 = auVar100._0_4_ >> 0x18;
  auVar153._0_8_ = CONCAT44(iVar202,iVar201);
  auVar153._8_4_ = auVar154._8_4_ >> 0x18;
  auVar157._12_4_ = auVar155._12_4_ >> 0x18;
  auVar157._0_12_ = auVar153;
  auVar375._0_4_ = (float)iVar201;
  fVar384 = (float)iVar202;
  auVar374._0_8_ = CONCAT44(fVar384,auVar375._0_4_);
  auVar374._8_4_ = (float)auVar153._8_4_;
  cVar148 = local_6a8[1] >> 7;
  auVar40[0xd] = 0;
  auVar40._0_13_ = auVar157._0_13_;
  auVar40[0xe] = cVar148;
  auVar45[0xc] = cVar148;
  auVar45._0_12_ = auVar153;
  auVar45._13_2_ = auVar40._13_2_;
  auVar50[0xb] = 0;
  auVar50._0_11_ = auVar153._0_11_;
  auVar50._12_3_ = auVar45._12_3_;
  auVar55[10] = cVar148;
  auVar55._0_10_ = auVar153._0_10_;
  auVar55._11_4_ = auVar50._11_4_;
  auVar60[9] = 0;
  auVar60._0_9_ = auVar153._0_9_;
  auVar60._10_5_ = auVar55._10_5_;
  auVar65[8] = local_6a8[1];
  auVar65._0_8_ = auVar153._0_8_;
  auVar65._9_6_ = auVar60._9_6_;
  Var88 = CONCAT81(CONCAT71(auVar65._8_7_,(char)((uint)uVar26 >> 0x18)),(short)local_6a8[0] >> 7);
  auVar70._6_9_ = Var88;
  auVar70[5] = (char)((uint)uVar26 >> 0x10);
  auVar70[4] = (undefined1)((short)local_6a8[0] >> 7);
  auVar70._0_4_ = iVar201;
  auVar101._2_11_ = auVar70._4_11_;
  auVar101[1] = (char)((uint)uVar26 >> 8);
  auVar101[0] = (undefined1)((short)local_6a8[0] >> 7);
  sVar149 = CONCAT11((char)uVar26,local_6a8[0]);
  auVar75._2_13_ = auVar101;
  auVar75._0_2_ = sVar149;
  uVar200 = (undefined2)Var88;
  auVar160._0_12_ = auVar75._0_12_;
  auVar160._12_2_ = uVar200;
  auVar160._14_2_ = uVar200;
  auVar159._12_4_ = auVar160._12_4_;
  auVar159._0_10_ = auVar75._0_10_;
  auVar159._10_2_ = auVar70._4_2_;
  auVar158._10_6_ = auVar159._10_6_;
  auVar158._0_8_ = auVar75._0_8_;
  auVar158._8_2_ = auVar70._4_2_;
  auVar102._4_8_ = auVar158._8_8_;
  auVar102._2_2_ = auVar101._0_2_;
  auVar102._0_2_ = auVar101._0_2_;
  fVar150 = (float)((int)sVar149 >> 8);
  fVar203 = (float)(auVar102._0_4_ >> 0x18);
  fVar206 = (float)(auVar158._8_4_ >> 0x18);
  uVar199 = (undefined1)((uint)uVar21 >> 0x18);
  uVar200 = CONCAT11(uVar199,uVar199);
  uVar199 = (undefined1)((uint)uVar21 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar200,uVar199),CONCAT14(uVar199,uVar21));
  uVar199 = (undefined1)((uint)uVar21 >> 8);
  uVar98 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar199),uVar199);
  sVar149 = CONCAT11((char)uVar21,(char)uVar21);
  uVar139 = CONCAT62(uVar98,sVar149);
  auVar434._8_4_ = 0;
  auVar434._0_8_ = uVar139;
  auVar434._12_2_ = uVar200;
  auVar434._14_2_ = uVar200;
  uVar200 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar433._12_4_ = auVar434._12_4_;
  auVar433._8_2_ = 0;
  auVar433._0_8_ = uVar139;
  auVar433._10_2_ = uVar200;
  auVar432._10_6_ = auVar433._10_6_;
  auVar432._8_2_ = uVar200;
  auVar432._0_8_ = uVar139;
  uVar200 = (undefined2)uVar98;
  auVar103._4_8_ = auVar432._8_8_;
  auVar103._2_2_ = uVar200;
  auVar103._0_2_ = uVar200;
  fVar429 = (float)((int)sVar149 >> 8);
  fVar442 = (float)(auVar103._0_4_ >> 0x18);
  fVar445 = (float)(auVar432._8_4_ >> 0x18);
  fVar485 = fVar450 * fVar261 + fVar463 * (float)iVar211 + fVar260;
  fVar488 = fVar450 * fVar276 + fVar463 * fVar364 + fVar275;
  fVar489 = fVar450 * fVar280 + fVar463 * (float)auVar216._8_4_ + auVar264._8_4_;
  fVar490 = fVar450 * (float)(auVar267._12_4_ >> 0x18) +
            fVar463 * (float)auVar223._12_4_ + auVar265._12_4_;
  fVar451 = fVar450 * (float)iVar259 + fVar463 * (float)iVar213 + fVar467 * local_568;
  fVar464 = fVar450 * fVar412 + fVar463 * fVar371 + fVar467 * fStack_564;
  fVar468 = fVar450 * (float)auVar152._8_4_ + fVar463 * (float)auVar218._8_4_ + fVar467 * fStack_560
  ;
  fVar471 = fVar450 * (float)auVar406._12_4_ +
            fVar463 * (float)auVar231._12_4_ + fVar467 * fStack_55c;
  fVar275 = fVar450 * auVar375._0_4_ + fVar463 * fVar150 + fVar467 * fVar429;
  fVar350 = fVar450 * fVar384 + fVar463 * fVar203 + fVar467 * fVar442;
  fVar352 = fVar450 * auVar374._8_4_ + fVar463 * fVar206 + fVar467 * fVar445;
  fVar450 = fVar450 * (float)auVar157._12_4_ +
            fVar463 * (float)(auVar159._12_4_ >> 0x18) + fVar467 * (float)(auVar433._12_4_ >> 0x18);
  uVar10 = *(undefined8 *)(prim + uVar132 * 7 + 6);
  uVar139 = *(ulong *)(prim + uVar132 * 0xb + 6);
  uVar11 = *(undefined8 *)(prim + uVar132 * 9 + 6);
  uVar12 = *(undefined8 *)(prim + uVar132 * 0xd + 6);
  fVar260 = fVar261 * fVar314 + (float)iVar211 * fVar336 + (float)iVar212 * fVar338;
  fVar261 = fVar276 * fVar314 + fVar364 * fVar336 + fVar478 * fVar338;
  fVar364 = fVar280 * fVar314 + (float)auVar216._8_4_ * fVar336 + (float)auVar217._8_4_ * fVar338;
  fVar463 = (float)(auVar267._12_4_ >> 0x18) * fVar314 +
            (float)auVar223._12_4_ * fVar336 + (float)auVar227._12_4_ * fVar338;
  fVar478 = (float)iVar259 * fVar314 + (float)iVar213 * fVar336 + local_568 * fVar338;
  fVar277 = fVar412 * fVar314 + fVar371 * fVar336 + fStack_564 * fVar338;
  fVar281 = (float)auVar152._8_4_ * fVar314 + (float)auVar218._8_4_ * fVar336 + fStack_560 * fVar338
  ;
  fVar284 = (float)auVar406._12_4_ * fVar314 +
            (float)auVar231._12_4_ * fVar336 + fStack_55c * fVar338;
  fVar429 = fVar314 * auVar375._0_4_ + fVar336 * fVar150 + fVar338 * fVar429;
  fVar442 = fVar314 * fVar384 + fVar336 * fVar203 + fVar338 * fVar442;
  fVar445 = fVar314 * auVar374._8_4_ + fVar336 * fVar206 + fVar338 * fVar445;
  fVar467 = fVar314 * (float)auVar157._12_4_ +
            fVar336 * (float)(auVar159._12_4_ >> 0x18) + fVar338 * (float)(auVar433._12_4_ >> 0x18);
  uVar355 = (uint)DAT_01f46710;
  uVar365 = DAT_01f46710._4_4_;
  uVar366 = DAT_01f46710._8_4_;
  uVar367 = DAT_01f46710._12_4_;
  uVar143 = -(uint)(1e-18 <= (float)((uint)fVar485 & uVar355));
  uVar144 = -(uint)(1e-18 <= (float)((uint)fVar488 & uVar365));
  uVar145 = -(uint)(1e-18 <= (float)((uint)fVar489 & uVar366));
  uVar146 = -(uint)(1e-18 <= (float)((uint)fVar490 & uVar367));
  auVar486._0_4_ = (uint)fVar485 & uVar143;
  auVar486._4_4_ = (uint)fVar488 & uVar144;
  auVar486._8_4_ = (uint)fVar489 & uVar145;
  auVar486._12_4_ = (uint)fVar490 & uVar146;
  auVar161._0_8_ = CONCAT44(~uVar144,~uVar143) & 0x219392ef219392ef;
  auVar161._8_4_ = ~uVar145 & 0x219392ef;
  auVar161._12_4_ = ~uVar146 & 0x219392ef;
  auVar161 = auVar161 | auVar486;
  uVar143 = -(uint)(1e-18 <= (float)((uint)fVar451 & uVar355));
  uVar144 = -(uint)(1e-18 <= (float)((uint)fVar464 & uVar365));
  uVar145 = -(uint)(1e-18 <= (float)((uint)fVar468 & uVar366));
  uVar146 = -(uint)(1e-18 <= (float)((uint)fVar471 & uVar367));
  auVar454._0_4_ = (uint)fVar451 & uVar143;
  auVar454._4_4_ = (uint)fVar464 & uVar144;
  auVar454._8_4_ = (uint)fVar468 & uVar145;
  auVar454._12_4_ = (uint)fVar471 & uVar146;
  auVar319._0_8_ = CONCAT44(~uVar144,~uVar143) & 0x219392ef219392ef;
  auVar319._8_4_ = ~uVar145 & 0x219392ef;
  auVar319._12_4_ = ~uVar146 & 0x219392ef;
  auVar319 = auVar319 | auVar454;
  uVar143 = -(uint)(1e-18 <= (float)((uint)fVar275 & uVar355));
  uVar144 = -(uint)(1e-18 <= (float)((uint)fVar350 & uVar365));
  uVar145 = -(uint)(1e-18 <= (float)((uint)fVar352 & uVar366));
  uVar146 = -(uint)(1e-18 <= (float)((uint)fVar450 & uVar367));
  auVar342._0_4_ = (uint)fVar275 & uVar143;
  auVar342._4_4_ = (uint)fVar350 & uVar144;
  auVar342._8_4_ = (uint)fVar352 & uVar145;
  auVar342._12_4_ = (uint)fVar450 & uVar146;
  auVar455._0_8_ = CONCAT44(~uVar144,~uVar143) & 0x219392ef219392ef;
  auVar455._8_4_ = ~uVar145 & 0x219392ef;
  auVar455._12_4_ = ~uVar146 & 0x219392ef;
  auVar455 = auVar455 | auVar342;
  auVar356 = rcpps(_DAT_01f46710,auVar161);
  fVar451 = auVar356._0_4_;
  auVar162._0_4_ = auVar161._0_4_ * fVar451;
  fVar464 = auVar356._4_4_;
  auVar162._4_4_ = auVar161._4_4_ * fVar464;
  fVar468 = auVar356._8_4_;
  auVar162._8_4_ = auVar161._8_4_ * fVar468;
  fVar471 = auVar356._12_4_;
  auVar162._12_4_ = auVar161._12_4_ * fVar471;
  fVar451 = (1.0 - auVar162._0_4_) * fVar451 + fVar451;
  fVar464 = (1.0 - auVar162._4_4_) * fVar464 + fVar464;
  fVar468 = (1.0 - auVar162._8_4_) * fVar468 + fVar468;
  fVar471 = (1.0 - auVar162._12_4_) * fVar471 + fVar471;
  auVar356 = rcpps(auVar162,auVar319);
  fVar150 = auVar356._0_4_;
  auVar320._0_4_ = auVar319._0_4_ * fVar150;
  fVar206 = auVar356._4_4_;
  fVar276 = auVar319._4_4_ * fVar206;
  auVar317._0_8_ = CONCAT44(fVar276,auVar320._0_4_);
  fVar336 = auVar356._8_4_;
  auVar317._8_4_ = auVar319._8_4_ * fVar336;
  fVar371 = auVar356._12_4_;
  fVar150 = (1.0 - auVar320._0_4_) * fVar150 + fVar150;
  fVar206 = (1.0 - fVar276) * fVar206 + fVar206;
  fVar336 = (1.0 - auVar317._8_4_) * fVar336 + fVar336;
  fVar371 = (1.0 - auVar319._12_4_ * fVar371) * fVar371 + fVar371;
  auVar356 = rcpps(auVar356,auVar455);
  fVar203 = auVar356._0_4_;
  fVar275 = auVar356._4_4_;
  fVar338 = auVar356._8_4_;
  fVar412 = auVar356._12_4_;
  uVar13 = *(undefined8 *)(prim + uVar132 * 0x12 + 6);
  fVar203 = (1.0 - auVar455._0_4_ * fVar203) * fVar203 + fVar203;
  fVar275 = (1.0 - auVar455._4_4_ * fVar275) * fVar275 + fVar275;
  fVar338 = (1.0 - auVar455._8_4_ * fVar338) * fVar338 + fVar338;
  fVar412 = (1.0 - auVar455._12_4_ * fVar412) * fVar412 + fVar412;
  uVar140 = *(ulong *)(prim + uVar132 * 0x16 + 6);
  auVar323._12_2_ = (short)((uint)fVar276 >> 0x10);
  auVar323._0_12_ = auVar317;
  auVar323._14_2_ = (short)((ulong)uVar10 >> 0x30);
  auVar322._12_4_ = auVar323._12_4_;
  auVar322._0_10_ = auVar317._0_10_;
  auVar322._10_2_ = (short)((ulong)uVar10 >> 0x20);
  auVar321._10_6_ = auVar322._10_6_;
  auVar321._8_2_ = SUB42(fVar276,0);
  auVar321._0_8_ = auVar317._0_8_;
  auVar320._8_8_ = auVar321._8_8_;
  sVar149 = (short)((ulong)uVar10 >> 0x10);
  auVar320._6_2_ = sVar149;
  auVar320._4_2_ = (short)((uint)auVar320._0_4_ >> 0x10);
  auVar324._0_4_ = (int)(short)uVar10;
  iVar259 = auVar320._4_4_ >> 0x10;
  auVar318._0_8_ = CONCAT44(iVar259,auVar324._0_4_);
  auVar318._8_4_ = auVar321._8_4_ >> 0x10;
  fVar488 = (float)iVar259;
  uVar414 = (undefined2)(uVar139 >> 0x30);
  auVar327._12_2_ = sVar149 >> 0xf;
  auVar327._0_12_ = auVar318;
  auVar327._14_2_ = uVar414;
  auVar326._12_4_ = auVar327._12_4_;
  auVar326._0_10_ = auVar318._0_10_;
  uVar411 = (undefined2)(uVar139 >> 0x20);
  auVar326._10_2_ = uVar411;
  auVar325._10_6_ = auVar326._10_6_;
  auVar325._8_2_ = sVar149;
  auVar325._0_8_ = auVar318._0_8_;
  auVar324._8_8_ = auVar325._8_8_;
  uVar200 = (undefined2)(uVar139 >> 0x10);
  auVar324._6_2_ = uVar200;
  auVar324._4_2_ = (short)uVar10 >> 0xf;
  auVar398._8_4_ = 0;
  auVar398._0_8_ = uVar139;
  auVar398._12_2_ = uVar414;
  auVar398._14_2_ = (short)((ulong)uVar11 >> 0x30);
  auVar397._12_4_ = auVar398._12_4_;
  auVar397._8_2_ = 0;
  auVar397._0_8_ = uVar139;
  auVar397._10_2_ = (short)((ulong)uVar11 >> 0x20);
  auVar396._10_6_ = auVar397._10_6_;
  auVar396._8_2_ = uVar411;
  auVar396._0_8_ = uVar139;
  auVar104._4_8_ = auVar396._8_8_;
  auVar104._2_2_ = (short)((ulong)uVar11 >> 0x10);
  auVar104._0_2_ = uVar200;
  auVar399._0_4_ = (float)(int)(short)uVar11;
  fVar485 = (float)(auVar104._0_4_ >> 0x10);
  auVar395._0_8_ = CONCAT44(fVar485,auVar399._0_4_);
  auVar395._8_4_ = (float)(auVar396._8_4_ >> 0x10);
  auVar378._12_2_ = (short)((uint)fVar384 >> 0x10);
  auVar378._0_12_ = auVar374;
  auVar378._14_2_ = (short)((ulong)uVar12 >> 0x30);
  auVar377._12_4_ = auVar378._12_4_;
  auVar377._0_10_ = auVar374._0_10_;
  auVar377._10_2_ = (short)((ulong)uVar12 >> 0x20);
  auVar376._10_6_ = auVar377._10_6_;
  auVar376._8_2_ = SUB42(fVar384,0);
  auVar376._0_8_ = auVar374._0_8_;
  auVar375._8_8_ = auVar376._8_8_;
  auVar375._6_2_ = (short)((ulong)uVar12 >> 0x10);
  auVar375._4_2_ = (short)((uint)auVar375._0_4_ >> 0x10);
  auVar402._12_2_ = (short)((uint)fVar485 >> 0x10);
  auVar402._0_12_ = auVar395;
  auVar402._14_2_ = (short)((ulong)uVar13 >> 0x30);
  auVar401._12_4_ = auVar402._12_4_;
  auVar401._0_10_ = auVar395._0_10_;
  auVar401._10_2_ = (short)((ulong)uVar13 >> 0x20);
  auVar400._10_6_ = auVar401._10_6_;
  auVar400._8_2_ = SUB42(fVar485,0);
  auVar400._0_8_ = auVar395._0_8_;
  auVar399._8_8_ = auVar400._8_8_;
  auVar399._6_2_ = (short)((ulong)uVar13 >> 0x10);
  auVar399._4_2_ = (short)((uint)auVar399._0_4_ >> 0x10);
  fVar384 = (float)(auVar399._4_4_ >> 0x10);
  fVar489 = (float)(auVar400._8_4_ >> 0x10);
  uVar200 = (undefined2)(uVar140 >> 0x30);
  auVar165._8_4_ = 0;
  auVar165._0_8_ = uVar140;
  auVar165._12_2_ = uVar200;
  auVar165._14_2_ = uVar200;
  uVar200 = (undefined2)(uVar140 >> 0x20);
  auVar164._12_4_ = auVar165._12_4_;
  auVar164._8_2_ = 0;
  auVar164._0_8_ = uVar140;
  auVar164._10_2_ = uVar200;
  auVar163._10_6_ = auVar164._10_6_;
  auVar163._8_2_ = uVar200;
  auVar163._0_8_ = uVar140;
  uVar200 = (undefined2)(uVar140 >> 0x10);
  auVar105._4_8_ = auVar163._8_8_;
  auVar105._2_2_ = uVar200;
  auVar105._0_2_ = uVar200;
  uVar138 = *(ulong *)(prim + uVar132 * 0x14 + 6);
  uVar200 = (undefined2)(uVar138 >> 0x30);
  auVar168._8_4_ = 0;
  auVar168._0_8_ = uVar138;
  auVar168._12_2_ = uVar200;
  auVar168._14_2_ = uVar200;
  uVar200 = (undefined2)(uVar138 >> 0x20);
  auVar167._12_4_ = auVar168._12_4_;
  auVar167._8_2_ = 0;
  auVar167._0_8_ = uVar138;
  auVar167._10_2_ = uVar200;
  auVar166._10_6_ = auVar167._10_6_;
  auVar166._8_2_ = uVar200;
  auVar166._0_8_ = uVar138;
  uVar200 = (undefined2)(uVar138 >> 0x10);
  auVar106._4_8_ = auVar166._8_8_;
  auVar106._2_2_ = uVar200;
  auVar106._0_2_ = uVar200;
  fVar276 = (float)(auVar106._0_4_ >> 0x10);
  fVar350 = (float)(auVar166._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar132 * 0x18 + 6);
  uVar200 = (undefined2)(uVar14 >> 0x30);
  auVar420._8_4_ = 0;
  auVar420._0_8_ = uVar14;
  auVar420._12_2_ = uVar200;
  auVar420._14_2_ = uVar200;
  uVar200 = (undefined2)(uVar14 >> 0x20);
  auVar419._12_4_ = auVar420._12_4_;
  auVar419._8_2_ = 0;
  auVar419._0_8_ = uVar14;
  auVar419._10_2_ = uVar200;
  auVar418._10_6_ = auVar419._10_6_;
  auVar418._8_2_ = uVar200;
  auVar418._0_8_ = uVar14;
  uVar200 = (undefined2)(uVar14 >> 0x10);
  auVar107._4_8_ = auVar418._8_8_;
  auVar107._2_2_ = uVar200;
  auVar107._0_2_ = uVar200;
  uVar15 = *(ulong *)(prim + uVar132 * 0x1d + 6);
  uVar200 = (undefined2)(uVar15 >> 0x30);
  auVar171._8_4_ = 0;
  auVar171._0_8_ = uVar15;
  auVar171._12_2_ = uVar200;
  auVar171._14_2_ = uVar200;
  uVar200 = (undefined2)(uVar15 >> 0x20);
  auVar170._12_4_ = auVar171._12_4_;
  auVar170._8_2_ = 0;
  auVar170._0_8_ = uVar15;
  auVar170._10_2_ = uVar200;
  auVar169._10_6_ = auVar170._10_6_;
  auVar169._8_2_ = uVar200;
  auVar169._0_8_ = uVar15;
  uVar200 = (undefined2)(uVar15 >> 0x10);
  auVar108._4_8_ = auVar169._8_8_;
  auVar108._2_2_ = uVar200;
  auVar108._0_2_ = uVar200;
  fVar280 = (float)(auVar108._0_4_ >> 0x10);
  fVar352 = (float)(auVar169._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar132 * 0x21 + 6);
  uVar200 = (undefined2)(uVar16 >> 0x30);
  auVar437._8_4_ = 0;
  auVar437._0_8_ = uVar16;
  auVar437._12_2_ = uVar200;
  auVar437._14_2_ = uVar200;
  uVar200 = (undefined2)(uVar16 >> 0x20);
  auVar436._12_4_ = auVar437._12_4_;
  auVar436._8_2_ = 0;
  auVar436._0_8_ = uVar16;
  auVar436._10_2_ = uVar200;
  auVar435._10_6_ = auVar436._10_6_;
  auVar435._8_2_ = uVar200;
  auVar435._0_8_ = uVar16;
  uVar200 = (undefined2)(uVar16 >> 0x10);
  auVar109._4_8_ = auVar435._8_8_;
  auVar109._2_2_ = uVar200;
  auVar109._0_2_ = uVar200;
  uVar17 = *(ulong *)(prim + uVar132 * 0x1f + 6);
  uVar200 = (undefined2)(uVar17 >> 0x30);
  auVar174._8_4_ = 0;
  auVar174._0_8_ = uVar17;
  auVar174._12_2_ = uVar200;
  auVar174._14_2_ = uVar200;
  uVar200 = (undefined2)(uVar17 >> 0x20);
  auVar173._12_4_ = auVar174._12_4_;
  auVar173._8_2_ = 0;
  auVar173._0_8_ = uVar17;
  auVar173._10_2_ = uVar200;
  auVar172._10_6_ = auVar173._10_6_;
  auVar172._8_2_ = uVar200;
  auVar172._0_8_ = uVar17;
  uVar200 = (undefined2)(uVar17 >> 0x10);
  auVar110._4_8_ = auVar172._8_8_;
  auVar110._2_2_ = uVar200;
  auVar110._0_2_ = uVar200;
  fVar314 = (float)(auVar110._0_4_ >> 0x10);
  fVar450 = (float)(auVar172._8_4_ >> 0x10);
  uVar18 = *(ulong *)(prim + uVar132 * 0x23 + 6);
  uVar200 = (undefined2)(uVar18 >> 0x30);
  auVar458._8_4_ = 0;
  auVar458._0_8_ = uVar18;
  auVar458._12_2_ = uVar200;
  auVar458._14_2_ = uVar200;
  uVar200 = (undefined2)(uVar18 >> 0x20);
  auVar457._12_4_ = auVar458._12_4_;
  auVar457._8_2_ = 0;
  auVar457._0_8_ = uVar18;
  auVar457._10_2_ = uVar200;
  auVar456._10_6_ = auVar457._10_6_;
  auVar456._8_2_ = uVar200;
  auVar456._0_8_ = uVar18;
  uVar200 = (undefined2)(uVar18 >> 0x10);
  auVar111._4_8_ = auVar456._8_8_;
  auVar111._2_2_ = uVar200;
  auVar111._0_2_ = uVar200;
  uVar131 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar328._0_8_ =
       CONCAT44(((((float)(auVar324._4_4_ >> 0x10) - fVar488) * fVar287 + fVar488) - fVar261) *
                fVar464,((((float)(int)(short)uVar139 - (float)auVar324._0_4_) * fVar287 +
                         (float)auVar324._0_4_) - fVar260) * fVar451);
  auVar328._8_4_ =
       ((((float)(auVar325._8_4_ >> 0x10) - (float)auVar318._8_4_) * fVar287 + (float)auVar318._8_4_
        ) - fVar364) * fVar468;
  auVar328._12_4_ =
       ((((float)(auVar326._12_4_ >> 0x10) - (float)(auVar322._12_4_ >> 0x10)) * fVar287 +
        (float)(auVar322._12_4_ >> 0x10)) - fVar463) * fVar471;
  auVar379._0_4_ =
       ((((float)(int)(short)uVar12 - auVar399._0_4_) * fVar287 + auVar399._0_4_) - fVar260) *
       fVar451;
  auVar379._4_4_ =
       ((((float)(auVar375._4_4_ >> 0x10) - fVar485) * fVar287 + fVar485) - fVar261) * fVar464;
  auVar379._8_4_ =
       ((((float)(auVar376._8_4_ >> 0x10) - auVar395._8_4_) * fVar287 + auVar395._8_4_) - fVar364) *
       fVar468;
  auVar379._12_4_ =
       ((((float)(auVar377._12_4_ >> 0x10) - (float)(auVar397._12_4_ >> 0x10)) * fVar287 +
        (float)(auVar397._12_4_ >> 0x10)) - fVar463) * fVar471;
  auVar403._0_8_ =
       CONCAT44(((((float)(auVar105._0_4_ >> 0x10) - fVar384) * fVar287 + fVar384) - fVar277) *
                fVar206,((((float)(int)(short)uVar140 - (float)(int)(short)uVar13) * fVar287 +
                         (float)(int)(short)uVar13) - fVar478) * fVar150);
  auVar403._8_4_ =
       ((((float)(auVar163._8_4_ >> 0x10) - fVar489) * fVar287 + fVar489) - fVar281) * fVar336;
  auVar403._12_4_ =
       ((((float)(auVar164._12_4_ >> 0x10) - (float)(auVar401._12_4_ >> 0x10)) * fVar287 +
        (float)(auVar401._12_4_ >> 0x10)) - fVar284) * fVar371;
  auVar421._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar138) * fVar287 +
        (float)(int)(short)uVar138) - fVar478) * fVar150;
  auVar421._4_4_ =
       ((((float)(auVar107._0_4_ >> 0x10) - fVar276) * fVar287 + fVar276) - fVar277) * fVar206;
  auVar421._8_4_ =
       ((((float)(auVar418._8_4_ >> 0x10) - fVar350) * fVar287 + fVar350) - fVar281) * fVar336;
  auVar421._12_4_ =
       ((((float)(auVar419._12_4_ >> 0x10) - (float)(auVar167._12_4_ >> 0x10)) * fVar287 +
        (float)(auVar167._12_4_ >> 0x10)) - fVar284) * fVar371;
  auVar438._0_8_ =
       CONCAT44(((((float)(auVar109._0_4_ >> 0x10) - fVar280) * fVar287 + fVar280) - fVar442) *
                fVar275,((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar287 +
                         (float)(int)(short)uVar15) - fVar429) * fVar203);
  auVar438._8_4_ =
       ((((float)(auVar435._8_4_ >> 0x10) - fVar352) * fVar287 + fVar352) - fVar445) * fVar338;
  auVar438._12_4_ =
       ((((float)(auVar436._12_4_ >> 0x10) - (float)(auVar170._12_4_ >> 0x10)) * fVar287 +
        (float)(auVar170._12_4_ >> 0x10)) - fVar467) * fVar412;
  auVar459._0_4_ =
       ((((float)(int)(short)uVar18 - (float)(int)(short)uVar17) * fVar287 +
        (float)(int)(short)uVar17) - fVar429) * fVar203;
  auVar459._4_4_ =
       ((((float)(auVar111._0_4_ >> 0x10) - fVar314) * fVar287 + fVar314) - fVar442) * fVar275;
  auVar459._8_4_ =
       ((((float)(auVar456._8_4_ >> 0x10) - fVar450) * fVar287 + fVar450) - fVar445) * fVar338;
  auVar459._12_4_ =
       ((((float)(auVar457._12_4_ >> 0x10) - (float)(auVar173._12_4_ >> 0x10)) * fVar287 +
        (float)(auVar173._12_4_ >> 0x10)) - fVar467) * fVar412;
  auVar290._8_4_ = auVar328._8_4_;
  auVar290._0_8_ = auVar328._0_8_;
  auVar290._12_4_ = auVar328._12_4_;
  auVar291 = minps(auVar290,auVar379);
  auVar235._8_4_ = auVar403._8_4_;
  auVar235._0_8_ = auVar403._0_8_;
  auVar235._12_4_ = auVar403._12_4_;
  auVar356 = minps(auVar235,auVar421);
  auVar291 = maxps(auVar291,auVar356);
  auVar236._8_4_ = auVar438._8_4_;
  auVar236._0_8_ = auVar438._0_8_;
  auVar236._12_4_ = auVar438._12_4_;
  auVar356 = minps(auVar236,auVar459);
  auVar269._4_4_ = uVar131;
  auVar269._0_4_ = uVar131;
  auVar269._8_4_ = uVar131;
  auVar269._12_4_ = uVar131;
  auVar356 = maxps(auVar356,auVar269);
  auVar356 = maxps(auVar291,auVar356);
  fVar150 = auVar356._0_4_ * 0.99999964;
  fVar260 = auVar356._4_4_ * 0.99999964;
  fVar203 = auVar356._8_4_ * 0.99999964;
  fVar261 = auVar356._12_4_ * 0.99999964;
  auVar356 = maxps(auVar328,auVar379);
  auVar291 = maxps(auVar403,auVar421);
  auVar356 = minps(auVar356,auVar291);
  auVar291 = maxps(auVar438,auVar459);
  uVar131 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar237._4_4_ = uVar131;
  auVar237._0_4_ = uVar131;
  auVar237._8_4_ = uVar131;
  auVar237._12_4_ = uVar131;
  auVar291 = minps(auVar291,auVar237);
  auVar356 = minps(auVar356,auVar291);
  auVar238._0_4_ = -(uint)(PVar20 != (Primitive)0x0 && fVar150 <= auVar356._0_4_ * 1.0000004);
  auVar238._4_4_ = -(uint)(1 < (byte)PVar20 && fVar260 <= auVar356._4_4_ * 1.0000004);
  auVar238._8_4_ = -(uint)(2 < (byte)PVar20 && fVar203 <= auVar356._8_4_ * 1.0000004);
  auVar238._12_4_ = -(uint)(3 < (byte)PVar20 && fVar261 <= auVar356._12_4_ * 1.0000004);
  uVar143 = movmskps((int)(uVar132 * 0x14),auVar238);
  auVar239._0_12_ = mm_lookupmask_ps._240_12_;
  auVar239._12_4_ = 0;
LAB_0037e185:
  if (uVar143 == 0) {
LAB_00380b47:
    return uVar143 != 0;
  }
  lVar135 = 0;
  if (uVar143 != 0) {
    for (; (uVar143 >> lVar135 & 1) == 0; lVar135 = lVar135 + 1) {
    }
  }
  uVar144 = *(uint *)(prim + 2);
  uVar139 = (ulong)uVar144;
  uVar145 = *(uint *)(prim + lVar135 * 4 + 6);
  pGVar27 = (context->scene->geometries).items[uVar139].ptr;
  uVar140 = (ulong)*(uint *)(*(long *)&pGVar27->field_0x58 +
                            (ulong)uVar145 *
                            pGVar27[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar206 = pGVar27->fnumTimeSegments;
  fVar275 = (pGVar27->time_range).lower;
  fVar276 = ((*(float *)(ray + k * 4 + 0x70) - fVar275) / ((pGVar27->time_range).upper - fVar275)) *
            fVar206;
  fVar275 = floorf(fVar276);
  fVar206 = fVar206 + -1.0;
  if (fVar206 <= fVar275) {
    fVar275 = fVar206;
  }
  fVar206 = 0.0;
  if (0.0 <= fVar275) {
    fVar206 = fVar275;
  }
  _Var28 = pGVar27[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar138 = (long)(int)fVar206 * 0x38;
  lVar135 = *(long *)(_Var28 + 0x10 + uVar138);
  lVar29 = *(long *)(_Var28 + 0x38 + uVar138);
  lVar30 = *(long *)(_Var28 + 0x48 + uVar138);
  pfVar1 = (float *)(lVar29 + uVar140 * lVar30);
  pfVar2 = (float *)(lVar29 + (uVar140 + 1) * lVar30);
  pfVar3 = (float *)(lVar29 + (uVar140 + 2) * lVar30);
  fVar276 = fVar276 - fVar206;
  fVar450 = 1.0 - fVar276;
  pfVar4 = (float *)(lVar29 + lVar30 * (uVar140 + 3));
  pRVar136 = *(RTCIntersectArguments **)(_Var28 + uVar138);
  pSVar133 = (StackEntry *)(lVar135 * (uVar140 + 3));
  ppSVar5 = (Scene **)((long)&pRVar136->flags + lVar135 * uVar140);
  ppSVar6 = (Scene **)((long)&pRVar136->flags + lVar135 * (uVar140 + 1));
  ppSVar7 = (Scene **)((long)&pRVar136->flags + lVar135 * (uVar140 + 2));
  fVar350 = *(float *)ppSVar5 * fVar450 + *pfVar1 * fVar276;
  fVar463 = *(float *)((long)ppSVar5 + 4) * fVar450 + pfVar1[1] * fVar276;
  fVar412 = *(float *)(ppSVar5 + 1) * fVar450 + pfVar1[2] * fVar276;
  fVar478 = *(float *)ppSVar6 * fVar450 + *pfVar2 * fVar276;
  fVar277 = *(float *)((long)ppSVar6 + 4) * fVar450 + pfVar2[1] * fVar276;
  fVar281 = *(float *)(ppSVar6 + 1) * fVar450 + pfVar2[2] * fVar276;
  fVar287 = *(float *)ppSVar7 * fVar450 + *pfVar3 * fVar276;
  fVar451 = *(float *)((long)ppSVar7 + 4) * fVar450 + pfVar3[1] * fVar276;
  fVar464 = *(float *)(ppSVar7 + 1) * fVar450 + pfVar3[2] * fVar276;
  pfVar8 = (float *)((long)&(pSVar133->valid).field_0 + (long)&pRVar136->flags);
  local_6a8._0_4_ = fVar450 * *pfVar8 + fVar276 * *pfVar4;
  local_6a8._4_4_ = fVar450 * pfVar8[1] + fVar276 * pfVar4[1];
  fStack_6a0 = fVar450 * pfVar8[2] + fVar276 * pfVar4[2];
  fVar206 = *(float *)(ray + k * 4 + 0x40);
  fVar275 = *(float *)(ray + k * 4 + 0x50);
  fVar314 = *(float *)(ray + k * 4 + 0x60);
  fVar280 = fVar275 * fVar275;
  fVar364 = fVar314 * fVar314;
  fVar338 = fVar280 + fVar206 * fVar206 + fVar364;
  auVar175._0_8_ = CONCAT44(fVar280 + fVar280 + 0.0,fVar338);
  auVar175._8_4_ = fVar280 + fVar364 + fVar364;
  auVar175._12_4_ = fVar280 + 0.0 + 0.0;
  auVar343._8_4_ = auVar175._8_4_;
  auVar343._0_8_ = auVar175._0_8_;
  auVar343._12_4_ = auVar175._12_4_;
  auVar356 = rcpss(auVar343,auVar175);
  fVar467 = (2.0 - auVar356._0_4_ * fVar338) * auVar356._0_4_ *
            (((fVar412 + fVar281 + fVar464 + fStack_6a0) * 0.25 - *(float *)(ray + k * 4 + 0x20)) *
             fVar314 +
            ((fVar463 + fVar277 + fVar451 + (float)local_6a8._4_4_) * 0.25 -
            *(float *)(ray + k * 4 + 0x10)) * fVar275 +
            ((fVar350 + fVar478 + fVar287 + (float)local_6a8._0_4_) * 0.25 - *(float *)(ray + k * 4)
            ) * fVar206);
  fVar280 = fVar206 * fVar467 + *(float *)(ray + k * 4);
  fVar336 = fVar275 * fVar467 + *(float *)(ray + k * 4 + 0x10);
  fVar352 = fVar314 * fVar467 + *(float *)(ray + k * 4 + 0x20);
  fVar350 = fVar350 - fVar280;
  fVar463 = fVar463 - fVar336;
  fVar412 = fVar412 - fVar352;
  fVar442 = (*(float *)((long)ppSVar5 + 0xc) * fVar450 + pfVar1[3] * fVar276) - 0.0;
  fVar287 = fVar287 - fVar280;
  fVar451 = fVar451 - fVar336;
  fVar464 = fVar464 - fVar352;
  fVar468 = (*(float *)((long)ppSVar7 + 0xc) * fVar450 + pfVar3[3] * fVar276) - 0.0;
  fVar478 = fVar478 - fVar280;
  fVar277 = fVar277 - fVar336;
  fVar281 = fVar281 - fVar352;
  fVar284 = (*(float *)((long)ppSVar6 + 0xc) * fVar450 + pfVar2[3] * fVar276) - 0.0;
  local_6a8._0_4_ = (float)local_6a8._0_4_ - fVar280;
  local_6a8._4_4_ = (float)local_6a8._4_4_ - fVar336;
  fStack_6a0 = fStack_6a0 - fVar352;
  fStack_69c = (fVar450 * pfVar8[3] + fVar276 * pfVar4[3]) - 0.0;
  fVar276 = fVar275 * fVar275;
  fVar471 = fVar206 * fVar206;
  fVar384 = fVar471 + fVar276 + fVar364;
  fVar485 = fVar471 + fVar276 + fVar364;
  fVar488 = fVar471 + fVar276 + fVar364;
  fVar471 = fVar471 + fVar276 + fVar364;
  fVar276 = *(float *)(ray + k * 4 + 0x40);
  fVar352 = ABS(fVar384);
  fVar371 = ABS(fVar485);
  fVar429 = ABS(fVar488);
  fVar445 = ABS(fVar471);
  fVar280 = *(float *)(ray + k * 4 + 0x30);
  fVar450 = fVar280 - fVar467;
  uVar146 = 0;
  bVar141 = 0;
  uVar355 = 1;
  fVar364 = 0.0;
  fVar336 = 1.0;
  local_598 = fVar467;
  fStack_594 = fVar467;
  fStack_590 = fVar467;
  fStack_58c = fVar467;
  local_568 = fVar350;
  fStack_564 = fVar463;
  fStack_560 = fVar412;
  fStack_55c = fVar442;
  do {
    fVar315 = fVar336 - fVar364;
    fVar214 = fVar315 * 0.11111111;
    local_5b8._4_4_ = fVar364;
    local_5b8._0_4_ = fVar364;
    fStack_5b0 = fVar364;
    fStack_5ac = fVar364;
    fVar316 = fVar315 * 0.0 + fVar364;
    fVar337 = fVar315 * 0.33333334 + fVar364;
    fVar339 = fVar315 * 0.6666667 + fVar364;
    fVar340 = fVar315 * 1.0 + fVar364;
    fVar341 = 1.0 - fVar316;
    fVar351 = 1.0 - fVar337;
    fVar353 = 1.0 - fVar339;
    fVar354 = 1.0 - fVar340;
    fVar489 = fVar316 * fVar341;
    fVar490 = fVar337 * fVar351;
    fVar207 = fVar339 * fVar353;
    fVar209 = fVar340 * fVar354;
    fVar262 = fVar341 * fVar341 * fVar341;
    fVar278 = fVar351 * fVar351 * fVar351;
    fVar282 = fVar353 * fVar353 * fVar353;
    fVar285 = fVar354 * fVar354 * fVar354;
    fVar394 = fVar316 * fVar316 * fVar316;
    fVar413 = fVar337 * fVar337 * fVar337;
    fVar415 = fVar339 * fVar339 * fVar339;
    fVar416 = fVar340 * fVar340 * fVar340;
    fVar263 = fVar262 * 0.16666667;
    fVar279 = fVar278 * 0.16666667;
    fVar283 = fVar282 * 0.16666667;
    fVar286 = fVar285 * 0.16666667;
    fVar372 = (fVar316 * fVar489 * 6.0 + fVar341 * fVar489 * 12.0 + fVar262 * 4.0 + fVar394) *
              0.16666667;
    fVar385 = (fVar337 * fVar490 * 6.0 + fVar351 * fVar490 * 12.0 + fVar278 * 4.0 + fVar413) *
              0.16666667;
    fVar388 = (fVar339 * fVar207 * 6.0 + fVar353 * fVar207 * 12.0 + fVar282 * 4.0 + fVar415) *
              0.16666667;
    fVar391 = (fVar340 * fVar209 * 6.0 + fVar354 * fVar209 * 12.0 + fVar285 * 4.0 + fVar416) *
              0.16666667;
    fVar262 = (fVar341 * fVar489 * 6.0 + fVar316 * fVar489 * 12.0 + fVar394 * 4.0 + fVar262) *
              0.16666667;
    fVar278 = (fVar351 * fVar490 * 6.0 + fVar337 * fVar490 * 12.0 + fVar413 * 4.0 + fVar278) *
              0.16666667;
    fVar308 = (fVar353 * fVar207 * 6.0 + fVar339 * fVar207 * 12.0 + fVar415 * 4.0 + fVar282) *
              0.16666667;
    fVar311 = (fVar354 * fVar209 * 6.0 + fVar340 * fVar209 * 12.0 + fVar416 * 4.0 + fVar285) *
              0.16666667;
    fVar394 = fVar394 * 0.16666667;
    fVar413 = fVar413 * 0.16666667;
    fVar415 = fVar415 * 0.16666667;
    fVar416 = fVar416 * 0.16666667;
    local_578 = fVar350 * fVar263 +
                fVar478 * fVar372 + fVar287 * fVar262 + (float)local_6a8._0_4_ * fVar394;
    fStack_574 = fVar350 * fVar279 +
                 fVar478 * fVar385 + fVar287 * fVar278 + (float)local_6a8._0_4_ * fVar413;
    fStack_570 = fVar350 * fVar283 +
                 fVar478 * fVar388 + fVar287 * fVar308 + (float)local_6a8._0_4_ * fVar415;
    fStack_56c = fVar350 * fVar286 +
                 fVar478 * fVar391 + fVar287 * fVar311 + (float)local_6a8._0_4_ * fVar416;
    fVar288 = fVar463 * fVar263 +
              fVar277 * fVar372 + fVar451 * fVar262 + (float)local_6a8._4_4_ * fVar394;
    fVar306 = fVar463 * fVar279 +
              fVar277 * fVar385 + fVar451 * fVar278 + (float)local_6a8._4_4_ * fVar413;
    fVar309 = fVar463 * fVar283 +
              fVar277 * fVar388 + fVar451 * fVar308 + (float)local_6a8._4_4_ * fVar415;
    fVar312 = fVar463 * fVar286 +
              fVar277 * fVar391 + fVar451 * fVar311 + (float)local_6a8._4_4_ * fVar416;
    fVar289 = fVar412 * fVar263 + fVar281 * fVar372 + fVar464 * fVar262 + fStack_6a0 * fVar394;
    fVar307 = fVar412 * fVar279 + fVar281 * fVar385 + fVar464 * fVar278 + fStack_6a0 * fVar413;
    fVar310 = fVar412 * fVar283 + fVar281 * fVar388 + fVar464 * fVar308 + fStack_6a0 * fVar415;
    fVar313 = fVar412 * fVar286 + fVar281 * fVar391 + fVar464 * fVar311 + fStack_6a0 * fVar416;
    fVar282 = fVar263 * fVar442 + fVar372 * fVar284 + fVar262 * fVar468 + fVar394 * fStack_69c;
    fVar285 = fVar279 * fVar442 + fVar385 * fVar284 + fVar278 * fVar468 + fVar413 * fStack_69c;
    auVar270._0_8_ = CONCAT44(fVar285,fVar282);
    auVar270._8_4_ =
         fVar283 * fVar442 + fVar388 * fVar284 + fVar308 * fVar468 + fVar415 * fStack_69c;
    auVar270._12_4_ =
         fVar286 * fVar442 + fVar391 * fVar284 + fVar311 * fVar468 + fVar416 * fStack_69c;
    fVar262 = -fVar341 * fVar341 * 0.5;
    fVar263 = -fVar351 * fVar351 * 0.5;
    fVar278 = -fVar353 * fVar353 * 0.5;
    fVar279 = -fVar354 * fVar354 * 0.5;
    fVar372 = (-fVar316 * fVar316 - fVar489 * 4.0) * 0.5;
    fVar385 = (-fVar337 * fVar337 - fVar490 * 4.0) * 0.5;
    fVar388 = (-fVar339 * fVar339 - fVar207 * 4.0) * 0.5;
    fVar391 = (-fVar340 * fVar340 - fVar209 * 4.0) * 0.5;
    fVar489 = (fVar489 * 4.0 + fVar341 * fVar341) * 0.5;
    fVar490 = (fVar490 * 4.0 + fVar351 * fVar351) * 0.5;
    fVar207 = (fVar207 * 4.0 + fVar353 * fVar353) * 0.5;
    fVar209 = (fVar209 * 4.0 + fVar354 * fVar354) * 0.5;
    fVar283 = fVar316 * fVar316 * 0.5;
    fVar286 = fVar337 * fVar337 * 0.5;
    fVar308 = fVar339 * fVar339 * 0.5;
    fVar311 = fVar340 * fVar340 * 0.5;
    fVar417 = (fVar350 * fVar262 +
              fVar478 * fVar372 + fVar287 * fVar489 + (float)local_6a8._0_4_ * fVar283) * fVar214;
    fVar426 = (fVar350 * fVar263 +
              fVar478 * fVar385 + fVar287 * fVar490 + (float)local_6a8._0_4_ * fVar286) * fVar214;
    fVar427 = (fVar350 * fVar278 +
              fVar478 * fVar388 + fVar287 * fVar207 + (float)local_6a8._0_4_ * fVar308) * fVar214;
    fVar428 = (fVar350 * fVar279 +
              fVar478 * fVar391 + fVar287 * fVar209 + (float)local_6a8._0_4_ * fVar311) * fVar214;
    fVar430 = (fVar463 * fVar262 +
              fVar277 * fVar372 + fVar451 * fVar489 + (float)local_6a8._4_4_ * fVar283) * fVar214;
    fVar443 = (fVar463 * fVar263 +
              fVar277 * fVar385 + fVar451 * fVar490 + (float)local_6a8._4_4_ * fVar286) * fVar214;
    auVar176._4_4_ = fVar443;
    auVar176._0_4_ = fVar430;
    fVar446 = (fVar463 * fVar278 +
              fVar277 * fVar388 + fVar451 * fVar207 + (float)local_6a8._4_4_ * fVar308) * fVar214;
    fVar448 = (fVar463 * fVar279 +
              fVar277 * fVar391 + fVar451 * fVar209 + (float)local_6a8._4_4_ * fVar311) * fVar214;
    fVar452 = (fVar412 * fVar262 + fVar281 * fVar372 + fVar464 * fVar489 + fStack_6a0 * fVar283) *
              fVar214;
    fVar465 = (fVar412 * fVar263 + fVar281 * fVar385 + fVar464 * fVar490 + fStack_6a0 * fVar286) *
              fVar214;
    fVar469 = (fVar412 * fVar278 + fVar281 * fVar388 + fVar464 * fVar207 + fStack_6a0 * fVar308) *
              fVar214;
    fVar472 = (fVar412 * fVar279 + fVar281 * fVar391 + fVar464 * fVar209 + fStack_6a0 * fVar311) *
              fVar214;
    fVar394 = fVar214 * (fVar263 * fVar442 +
                        fVar385 * fVar284 + fVar490 * fVar468 + fVar286 * fStack_69c);
    fVar413 = fVar214 * (fVar278 * fVar442 +
                        fVar388 * fVar284 + fVar207 * fVar468 + fVar308 * fStack_69c);
    fVar415 = fVar214 * (fVar279 * fVar442 +
                        fVar391 * fVar284 + fVar209 * fVar468 + fVar311 * fStack_69c);
    auVar487._4_4_ = auVar270._8_4_;
    auVar487._0_4_ = fVar285;
    auVar487._8_4_ = auVar270._12_4_;
    auVar487._12_4_ = 0;
    auVar357._0_8_ = CONCAT44(auVar270._8_4_ - fVar413,fVar285 - fVar394);
    auVar357._8_4_ = auVar270._12_4_ - fVar415;
    auVar357._12_4_ = 0;
    fVar337 = fVar306 - fVar288;
    fVar340 = fVar309 - fVar306;
    fVar351 = fVar312 - fVar309;
    fVar385 = 0.0 - fVar312;
    local_5a8._0_4_ = fVar307 - fVar289;
    local_5a8._4_4_ = fVar310 - fVar307;
    fStack_5a0 = fVar313 - fVar310;
    fStack_59c = 0.0 - fVar313;
    fVar353 = fVar430 * (float)local_5a8._0_4_ - fVar452 * fVar337;
    fVar388 = fVar443 * (float)local_5a8._4_4_ - fVar465 * fVar340;
    fVar354 = fVar446 * fStack_5a0 - fVar469 * fVar351;
    fVar391 = fVar448 * fStack_59c - fVar472 * fVar385;
    fVar476 = fStack_574 - local_578;
    fVar479 = fStack_570 - fStack_574;
    fVar481 = fStack_56c - fStack_570;
    fVar483 = 0.0 - fStack_56c;
    fVar278 = fVar452 * fVar476 - fVar417 * (float)local_5a8._0_4_;
    fVar286 = fVar465 * fVar479 - fVar426 * (float)local_5a8._4_4_;
    fVar311 = fVar469 * fVar481 - fVar427 * fStack_5a0;
    fVar339 = fVar472 * fVar483 - fVar428 * fStack_59c;
    fVar416 = fVar417 * fVar337 - fVar430 * fVar476;
    fVar386 = fVar426 * fVar340 - fVar443 * fVar479;
    fVar389 = fVar427 * fVar351 - fVar446 * fVar481;
    fVar392 = fVar428 * fVar385 - fVar448 * fVar483;
    auVar240._0_4_ = (float)local_5a8._0_4_ * (float)local_5a8._0_4_;
    auVar240._4_4_ = (float)local_5a8._4_4_ * (float)local_5a8._4_4_;
    auVar240._8_4_ = fStack_5a0 * fStack_5a0;
    auVar240._12_4_ = fStack_59c * fStack_59c;
    auVar380._0_4_ = fVar476 * fVar476 + fVar337 * fVar337 + auVar240._0_4_;
    auVar380._4_4_ = fVar479 * fVar479 + fVar340 * fVar340 + auVar240._4_4_;
    auVar380._8_4_ = fVar481 * fVar481 + fVar351 * fVar351 + auVar240._8_4_;
    auVar380._12_4_ = fVar483 * fVar483 + fVar385 * fVar385 + auVar240._12_4_;
    auVar356 = rcpps(auVar240,auVar380);
    fVar490 = auVar356._0_4_;
    fVar207 = auVar356._4_4_;
    fVar209 = auVar356._8_4_;
    fVar263 = auVar356._12_4_;
    fVar490 = (1.0 - fVar490 * auVar380._0_4_) * fVar490 + fVar490;
    fVar207 = (1.0 - fVar207 * auVar380._4_4_) * fVar207 + fVar207;
    fVar209 = (1.0 - fVar209 * auVar380._8_4_) * fVar209 + fVar209;
    fVar263 = (1.0 - fVar263 * auVar380._12_4_) * fVar263 + fVar263;
    auVar176._8_4_ = fVar446;
    auVar176._12_4_ = fVar448;
    fVar279 = (float)local_5a8._0_4_ * fVar443 - fVar337 * fVar465;
    fVar308 = (float)local_5a8._4_4_ * fVar446 - fVar340 * fVar469;
    fVar316 = fStack_5a0 * fVar448 - fVar351 * fVar472;
    fVar341 = fStack_59c * 0.0 - fVar385 * 0.0;
    fVar431 = fVar476 * fVar465 - (float)local_5a8._0_4_ * fVar426;
    fVar444 = fVar479 * fVar469 - (float)local_5a8._4_4_ * fVar427;
    fVar447 = fVar481 * fVar472 - fStack_5a0 * fVar428;
    fVar449 = fVar483 * 0.0 - fStack_59c * 0.0;
    fVar453 = fVar337 * fVar426 - fVar476 * fVar443;
    fVar466 = fVar340 * fVar427 - fVar479 * fVar446;
    fVar470 = fVar351 * fVar428 - fVar481 * fVar448;
    fVar473 = fVar385 * 0.0 - fVar483 * 0.0;
    auVar344._0_4_ = (fVar353 * fVar353 + fVar278 * fVar278 + fVar416 * fVar416) * fVar490;
    auVar344._4_4_ = (fVar388 * fVar388 + fVar286 * fVar286 + fVar386 * fVar386) * fVar207;
    auVar344._8_4_ = (fVar354 * fVar354 + fVar311 * fVar311 + fVar389 * fVar389) * fVar209;
    auVar344._12_4_ = (fVar391 * fVar391 + fVar339 * fVar339 + fVar392 * fVar392) * fVar263;
    auVar329._0_4_ = (fVar279 * fVar279 + fVar431 * fVar431 + fVar453 * fVar453) * fVar490;
    auVar329._4_4_ = (fVar308 * fVar308 + fVar444 * fVar444 + fVar466 * fVar466) * fVar207;
    auVar329._8_4_ = (fVar316 * fVar316 + fVar447 * fVar447 + fVar470 * fVar470) * fVar209;
    auVar329._12_4_ = (fVar341 * fVar341 + fVar449 * fVar449 + fVar473 * fVar473) * fVar263;
    auVar291 = maxps(auVar344,auVar329);
    auVar368._0_4_ =
         fVar214 * (fVar262 * fVar442 + fVar372 * fVar284 + fVar489 * fVar468 + fVar283 * fStack_69c
                   ) + fVar282;
    auVar368._4_4_ = fVar394 + fVar285;
    auVar368._8_4_ = fVar413 + auVar270._8_4_;
    auVar368._12_4_ = fVar415 + auVar270._12_4_;
    auVar404._8_4_ = auVar270._8_4_;
    auVar404._0_8_ = auVar270._0_8_;
    auVar404._12_4_ = auVar270._12_4_;
    auVar405 = maxps(auVar404,auVar368);
    auVar330._8_4_ = auVar357._8_4_;
    auVar330._0_8_ = auVar357._0_8_;
    auVar330._12_4_ = 0;
    auVar356 = maxps(auVar330,auVar487);
    auVar406 = maxps(auVar405,auVar356);
    auVar356 = minps(auVar270,auVar368);
    auVar405 = minps(auVar357,auVar487);
    auVar405 = minps(auVar356,auVar405);
    auVar356 = sqrtps(auVar176 >> 0x20,auVar291);
    auVar291 = rsqrtps(auVar356,auVar380);
    fVar489 = auVar291._0_4_;
    fVar490 = auVar291._4_4_;
    fVar207 = auVar291._8_4_;
    fVar209 = auVar291._12_4_;
    fVar214 = fVar489 * 1.5 - fVar489 * fVar489 * auVar380._0_4_ * 0.5 * fVar489;
    fVar262 = fVar490 * 1.5 - fVar490 * fVar490 * auVar380._4_4_ * 0.5 * fVar490;
    fVar279 = fVar207 * 1.5 - fVar207 * fVar207 * auVar380._8_4_ * 0.5 * fVar207;
    fVar283 = fVar209 * 1.5 - fVar209 * fVar209 * auVar380._12_4_ * 0.5 * fVar209;
    fVar388 = 0.0 - fVar288;
    fVar391 = 0.0 - fVar306;
    fVar413 = 0.0 - fVar309;
    fVar416 = 0.0 - fVar312;
    local_588._0_4_ = 0.0 - fVar289;
    local_588._4_4_ = 0.0 - fVar307;
    fStack_580 = 0.0 - fVar310;
    fStack_57c = 0.0 - fVar313;
    fVar489 = 0.0 - local_578;
    fVar207 = 0.0 - fStack_574;
    fVar263 = 0.0 - fStack_570;
    fVar282 = 0.0 - fStack_56c;
    auVar331._0_4_ = fVar388 * fVar388 + (float)local_588._0_4_ * (float)local_588._0_4_;
    auVar331._4_4_ = fVar391 * fVar391 + (float)local_588._4_4_ * (float)local_588._4_4_;
    auVar331._8_4_ = fVar413 * fVar413 + fStack_580 * fStack_580;
    auVar331._12_4_ = fVar416 * fVar416 + fStack_57c * fStack_57c;
    fVar339 = fVar276 * fVar476 * fVar214 +
              fVar275 * fVar337 * fVar214 + fVar314 * (float)local_5a8._0_4_ * fVar214;
    fVar341 = fVar276 * fVar479 * fVar262 +
              fVar275 * fVar340 * fVar262 + fVar314 * (float)local_5a8._4_4_ * fVar262;
    fVar372 = fVar276 * fVar481 * fVar279 +
              fVar275 * fVar351 * fVar279 + fVar314 * fStack_5a0 * fVar279;
    fVar353 = fVar276 * fVar483 * fVar283 +
              fVar275 * fVar385 * fVar283 + fVar314 * fStack_59c * fVar283;
    fVar477 = fVar476 * fVar214 * fVar489 +
              fVar337 * fVar214 * fVar388 +
              (float)local_5a8._0_4_ * fVar214 * (float)local_588._0_4_;
    fVar480 = fVar479 * fVar262 * fVar207 +
              fVar340 * fVar262 * fVar391 +
              (float)local_5a8._4_4_ * fVar262 * (float)local_588._4_4_;
    fVar482 = fVar481 * fVar279 * fVar263 +
              fVar351 * fVar279 * fVar413 + fStack_5a0 * fVar279 * fStack_580;
    fVar484 = fVar483 * fVar283 * fVar282 +
              fVar385 * fVar283 * fVar416 + fStack_59c * fVar283 * fStack_57c;
    fVar389 = (fVar276 * fVar489 + fVar275 * fVar388 + fVar314 * (float)local_588._0_4_) -
              fVar339 * fVar477;
    fVar392 = (fVar276 * fVar207 + fVar275 * fVar391 + fVar314 * (float)local_588._4_4_) -
              fVar341 * fVar480;
    fVar431 = (fVar276 * fVar263 + fVar275 * fVar413 + fVar314 * fStack_580) - fVar372 * fVar482;
    fVar444 = (fVar276 * fVar282 + fVar275 * fVar416 + fVar314 * fStack_57c) - fVar353 * fVar484;
    fVar286 = (fVar489 * fVar489 + auVar331._0_4_) - fVar477 * fVar477;
    fVar308 = (fVar207 * fVar207 + auVar331._4_4_) - fVar480 * fVar480;
    fVar311 = (fVar263 * fVar263 + auVar331._8_4_) - fVar482 * fVar482;
    fVar316 = (fVar282 * fVar282 + auVar331._12_4_) - fVar484 * fVar484;
    fVar490 = (auVar406._0_4_ + auVar356._0_4_) * 1.0000002;
    fVar209 = (auVar406._4_4_ + auVar356._4_4_) * 1.0000002;
    fVar278 = (auVar406._8_4_ + auVar356._8_4_) * 1.0000002;
    fVar285 = (auVar406._12_4_ + auVar356._12_4_) * 1.0000002;
    fVar447 = fVar286 - fVar490 * fVar490;
    fVar449 = fVar308 - fVar209 * fVar209;
    fVar453 = fVar311 - fVar278 * fVar278;
    fVar466 = fVar316 - fVar285 * fVar285;
    fVar470 = fVar339 * fVar339;
    fVar473 = fVar341 * fVar341;
    fVar490 = fVar384 - fVar470;
    fVar209 = fVar485 - fVar473;
    fVar278 = fVar488 - fVar372 * fVar372;
    fVar285 = fVar471 - fVar353 * fVar353;
    fVar389 = fVar389 + fVar389;
    fVar392 = fVar392 + fVar392;
    fVar431 = fVar431 + fVar431;
    fVar444 = fVar444 + fVar444;
    auVar422._0_4_ = fVar389 * fVar389 - fVar490 * 4.0 * fVar447;
    auVar422._4_4_ = fVar392 * fVar392 - fVar209 * 4.0 * fVar449;
    auVar422._8_4_ = fVar431 * fVar431 - fVar278 * 4.0 * fVar453;
    auVar422._12_4_ = fVar444 * fVar444 - fVar285 * 4.0 * fVar466;
    local_468._4_4_ = (auVar405._4_4_ - auVar356._4_4_) * 0.99999976;
    local_468._0_4_ = (auVar405._0_4_ - auVar356._0_4_) * 0.99999976;
    fStack_460 = (auVar405._8_4_ - auVar356._8_4_) * 0.99999976;
    fStack_45c = (auVar405._12_4_ - auVar356._12_4_) * 0.99999976;
    auVar345._4_4_ = -(uint)(0.0 <= auVar422._4_4_);
    auVar345._0_4_ = -(uint)(0.0 <= auVar422._0_4_);
    auVar345._8_4_ = -(uint)(0.0 <= auVar422._8_4_);
    auVar345._12_4_ = -(uint)(0.0 <= auVar422._12_4_);
    iVar259 = movmskps((int)pSVar133,auVar345);
    fVar474 = ABS(fVar372 * fVar372);
    fVar475 = ABS(fVar353 * fVar353);
    fVar354 = ABS(fVar490);
    fVar394 = ABS(fVar209);
    fVar415 = ABS(fVar278);
    fVar386 = ABS(fVar285);
    auVar439._4_4_ = fVar275;
    auVar439._0_4_ = fVar275;
    auVar439._8_4_ = fVar275;
    auVar439._12_4_ = fVar275;
    if (iVar259 == 0) {
      iVar259 = 0;
      auVar179 = _DAT_01f45a40;
      auVar381 = _DAT_01f45a30;
    }
    else {
      auVar291 = sqrtps(auVar439,auVar422);
      bVar142 = 0.0 <= auVar422._0_4_;
      uVar365 = -(uint)bVar142;
      bVar32 = 0.0 <= auVar422._4_4_;
      uVar366 = -(uint)bVar32;
      bVar33 = 0.0 <= auVar422._8_4_;
      uVar367 = -(uint)bVar33;
      bVar34 = 0.0 <= auVar422._12_4_;
      uVar147 = -(uint)bVar34;
      auVar177._0_4_ = fVar490 + fVar490;
      auVar177._4_4_ = fVar209 + fVar209;
      auVar177._8_4_ = fVar278 + fVar278;
      auVar177._12_4_ = fVar285 + fVar285;
      auVar356 = rcpps(auVar331,auVar177);
      fVar373 = auVar356._0_4_;
      fVar387 = auVar356._4_4_;
      fVar390 = auVar356._8_4_;
      fVar393 = auVar356._12_4_;
      fVar373 = (1.0 - auVar177._0_4_ * fVar373) * fVar373 + fVar373;
      fVar387 = (1.0 - auVar177._4_4_ * fVar387) * fVar387 + fVar387;
      fVar390 = (1.0 - auVar177._8_4_ * fVar390) * fVar390 + fVar390;
      fVar393 = (1.0 - auVar177._12_4_ * fVar393) * fVar393 + fVar393;
      fVar151 = (-fVar389 - auVar291._0_4_) * fVar373;
      fVar204 = (-fVar392 - auVar291._4_4_) * fVar387;
      fVar208 = (-fVar431 - auVar291._8_4_) * fVar390;
      fVar210 = (-fVar444 - auVar291._12_4_) * fVar393;
      fVar373 = (auVar291._0_4_ - fVar389) * fVar373;
      fVar387 = (auVar291._4_4_ - fVar392) * fVar387;
      fVar390 = (auVar291._8_4_ - fVar431) * fVar390;
      fVar393 = (auVar291._12_4_ - fVar444) * fVar393;
      local_208 = (fVar339 * fVar151 + fVar477) * fVar214;
      fStack_204 = (fVar341 * fVar204 + fVar480) * fVar262;
      fStack_200 = (fVar372 * fVar208 + fVar482) * fVar279;
      fStack_1fc = (fVar353 * fVar210 + fVar484) * fVar283;
      local_1f8 = (fVar339 * fVar373 + fVar477) * fVar214;
      fStack_1f4 = (fVar341 * fVar387 + fVar480) * fVar262;
      fStack_1f0 = (fVar372 * fVar390 + fVar482) * fVar279;
      fStack_1ec = (fVar353 * fVar393 + fVar484) * fVar283;
      auVar178._0_4_ = (uint)fVar151 & uVar365;
      auVar178._4_4_ = (uint)fVar204 & uVar366;
      auVar178._8_4_ = (uint)fVar208 & uVar367;
      auVar178._12_4_ = (uint)fVar210 & uVar147;
      auVar381._0_8_ = CONCAT44(~uVar366,~uVar365) & 0x7f8000007f800000;
      auVar381._8_4_ = ~uVar367 & 0x7f800000;
      auVar381._12_4_ = ~uVar147 & 0x7f800000;
      auVar381 = auVar381 | auVar178;
      auVar460._0_4_ = (uint)fVar373 & uVar365;
      auVar460._4_4_ = (uint)fVar387 & uVar366;
      auVar460._8_4_ = (uint)fVar390 & uVar367;
      auVar460._12_4_ = (uint)fVar393 & uVar147;
      auVar179._0_8_ = CONCAT44(~uVar366,~uVar365) & 0xff800000ff800000;
      auVar179._8_4_ = ~uVar367 & 0xff800000;
      auVar179._12_4_ = ~uVar147 & 0xff800000;
      auVar179 = auVar179 | auVar460;
      auVar83._4_4_ = fVar371;
      auVar83._0_4_ = fVar352;
      auVar83._8_4_ = fVar429;
      auVar83._12_4_ = fVar445;
      auVar35._8_4_ = fVar474;
      auVar35._0_8_ = CONCAT44(fVar473,fVar470) & 0x7fffffff7fffffff;
      auVar35._12_4_ = fVar475;
      auVar356 = maxps(auVar83,auVar35);
      fVar151 = auVar356._0_4_ * 1.9073486e-06;
      fVar204 = auVar356._4_4_ * 1.9073486e-06;
      fVar208 = auVar356._8_4_ * 1.9073486e-06;
      fVar210 = auVar356._12_4_ * 1.9073486e-06;
      auVar461._0_4_ = -(uint)(fVar354 < fVar151 && bVar142);
      auVar461._4_4_ = -(uint)(fVar394 < fVar204 && bVar32);
      auVar461._8_4_ = -(uint)(fVar415 < fVar208 && bVar33);
      auVar461._12_4_ = -(uint)(fVar386 < fVar210 && bVar34);
      iVar259 = movmskps(iVar259,auVar461);
      if (iVar259 != 0) {
        uVar365 = -(uint)(fVar447 <= 0.0);
        uVar366 = -(uint)(fVar449 <= 0.0);
        uVar367 = -(uint)(fVar453 <= 0.0);
        uVar147 = -(uint)(fVar466 <= 0.0);
        auVar335._0_4_ = (uVar365 & 0xff800000 | ~uVar365 & 0x7f800000) & auVar461._0_4_;
        auVar335._4_4_ = (uVar366 & 0xff800000 | ~uVar366 & 0x7f800000) & auVar461._4_4_;
        auVar335._8_4_ = (uVar367 & 0xff800000 | ~uVar367 & 0x7f800000) & auVar461._8_4_;
        auVar335._12_4_ = (uVar147 & 0xff800000 | ~uVar147 & 0x7f800000) & auVar461._12_4_;
        auVar409._0_4_ = ~auVar461._0_4_ & auVar381._0_4_;
        auVar409._4_4_ = ~auVar461._4_4_ & auVar381._4_4_;
        auVar409._8_4_ = ~auVar461._8_4_ & auVar381._8_4_;
        auVar409._12_4_ = ~auVar461._12_4_ & auVar381._12_4_;
        auVar381 = auVar409 | auVar335;
        auVar349._0_4_ = (uVar365 & 0x7f800000 | ~uVar365 & 0xff800000) & auVar461._0_4_;
        auVar349._4_4_ = (uVar366 & 0x7f800000 | ~uVar366 & 0xff800000) & auVar461._4_4_;
        auVar349._8_4_ = (uVar367 & 0x7f800000 | ~uVar367 & 0xff800000) & auVar461._8_4_;
        auVar349._12_4_ = (uVar147 & 0x7f800000 | ~uVar147 & 0xff800000) & auVar461._12_4_;
        auVar462._0_4_ = ~auVar461._0_4_ & auVar179._0_4_;
        auVar462._4_4_ = ~auVar461._4_4_ & auVar179._4_4_;
        auVar462._8_4_ = ~auVar461._8_4_ & auVar179._8_4_;
        auVar462._12_4_ = ~auVar461._12_4_ & auVar179._12_4_;
        auVar179 = auVar462 | auVar349;
        auVar345._4_4_ = -(uint)((fVar204 <= fVar394 || fVar449 <= 0.0) && bVar32);
        auVar345._0_4_ = -(uint)((fVar151 <= fVar354 || fVar447 <= 0.0) && bVar142);
        auVar345._8_4_ = -(uint)((fVar208 <= fVar415 || fVar453 <= 0.0) && bVar33);
        auVar345._12_4_ = -(uint)((fVar210 <= fVar386 || fVar466 <= 0.0) && bVar34);
      }
    }
    auVar346._0_4_ = (auVar345._0_4_ << 0x1f) >> 0x1f;
    auVar346._4_4_ = (auVar345._4_4_ << 0x1f) >> 0x1f;
    auVar346._8_4_ = (auVar345._8_4_ << 0x1f) >> 0x1f;
    auVar346._12_4_ = (auVar345._12_4_ << 0x1f) >> 0x1f;
    auVar346 = auVar346 & auVar239;
    iVar259 = movmskps(iVar259,auVar346);
    pRVar137 = pRVar136;
    if (iVar259 != 0) {
      fVar447 = *(float *)(ray + k * 4 + 0x80);
      auVar407._0_4_ = fVar447 - fVar467;
      auVar407._4_4_ = auVar407._0_4_;
      auVar407._8_4_ = auVar407._0_4_;
      auVar407._12_4_ = auVar407._0_4_;
      auVar405 = minps(auVar407,auVar179);
      auVar87._4_4_ = fVar450;
      auVar87._0_4_ = fVar450;
      auVar87._8_4_ = fVar450;
      auVar87._12_4_ = fVar450;
      auVar291 = maxps(auVar87,auVar381);
      auVar180._0_4_ = fVar430 * auVar439._0_4_ + fVar452 * fVar314;
      auVar180._4_4_ = fVar443 * auVar439._4_4_ + fVar465 * fVar314;
      auVar180._8_4_ = fVar446 * auVar439._8_4_ + fVar469 * fVar314;
      auVar180._12_4_ = fVar448 * auVar439._12_4_ + fVar472 * fVar314;
      auVar292._0_4_ = fVar417 * fVar276 + auVar180._0_4_;
      auVar292._4_4_ = fVar426 * fVar276 + auVar180._4_4_;
      auVar292._8_4_ = fVar427 * fVar276 + auVar180._8_4_;
      auVar292._12_4_ = fVar428 * fVar276 + auVar180._12_4_;
      auVar356 = rcpps(auVar180,auVar292);
      fVar449 = auVar356._0_4_;
      fVar453 = auVar356._4_4_;
      fVar466 = auVar356._8_4_;
      fVar151 = auVar356._12_4_;
      fVar489 = ((1.0 - auVar292._0_4_ * fVar449) * fVar449 + fVar449) *
                -(fVar489 * fVar417 + fVar388 * fVar430 + (float)local_588._0_4_ * fVar452);
      fVar207 = ((1.0 - auVar292._4_4_ * fVar453) * fVar453 + fVar453) *
                -(fVar207 * fVar426 + fVar391 * fVar443 + (float)local_588._4_4_ * fVar465);
      fVar263 = ((1.0 - auVar292._8_4_ * fVar466) * fVar466 + fVar466) *
                -(fVar263 * fVar427 + fVar413 * fVar446 + fStack_580 * fVar469);
      fVar282 = ((1.0 - auVar292._12_4_ * fVar151) * fVar151 + fVar151) *
                -(fVar282 * fVar428 + fVar416 * fVar448 + fStack_57c * fVar472);
      uVar365 = -(uint)(auVar292._0_4_ < 0.0 || ABS(auVar292._0_4_) < 1e-18);
      uVar366 = -(uint)(auVar292._4_4_ < 0.0 || ABS(auVar292._4_4_) < 1e-18);
      uVar367 = -(uint)(auVar292._8_4_ < 0.0 || ABS(auVar292._8_4_) < 1e-18);
      uVar147 = -(uint)(auVar292._12_4_ < 0.0 || ABS(auVar292._12_4_) < 1e-18);
      auVar358._0_8_ = CONCAT44(uVar366,uVar365) & 0xff800000ff800000;
      auVar358._8_4_ = uVar367 & 0xff800000;
      auVar358._12_4_ = uVar147 & 0xff800000;
      auVar181._0_4_ = ~uVar365 & (uint)fVar489;
      auVar181._4_4_ = ~uVar366 & (uint)fVar207;
      auVar181._8_4_ = ~uVar367 & (uint)fVar263;
      auVar181._12_4_ = ~uVar147 & (uint)fVar282;
      auVar356 = maxps(auVar291,auVar181 | auVar358);
      uVar365 = -(uint)(0.0 < auVar292._0_4_ || ABS(auVar292._0_4_) < 1e-18);
      uVar366 = -(uint)(0.0 < auVar292._4_4_ || ABS(auVar292._4_4_) < 1e-18);
      uVar367 = -(uint)(0.0 < auVar292._8_4_ || ABS(auVar292._8_4_) < 1e-18);
      uVar147 = -(uint)(0.0 < auVar292._12_4_ || ABS(auVar292._12_4_) < 1e-18);
      auVar182._0_8_ = CONCAT44(uVar366,uVar365) & 0x7f8000007f800000;
      auVar182._8_4_ = uVar367 & 0x7f800000;
      auVar182._12_4_ = uVar147 & 0x7f800000;
      auVar293._0_4_ = ~uVar365 & (uint)fVar489;
      auVar293._4_4_ = ~uVar366 & (uint)fVar207;
      auVar293._8_4_ = ~uVar367 & (uint)fVar263;
      auVar293._12_4_ = ~uVar147 & (uint)fVar282;
      auVar405 = minps(auVar405,auVar293 | auVar182);
      auVar294._0_4_ = (0.0 - fVar306) * -fVar443 + (0.0 - fVar307) * -fVar465;
      auVar294._4_4_ = (0.0 - fVar309) * -fVar446 + (0.0 - fVar310) * -fVar469;
      auVar294._8_4_ = (0.0 - fVar312) * -fVar448 + (0.0 - fVar313) * -fVar472;
      auVar294._12_4_ = 0x80000000;
      auVar241._0_4_ = -fVar426 * fVar276 + -fVar443 * fVar275 + -fVar465 * fVar314;
      auVar241._4_4_ = -fVar427 * fVar276 + -fVar446 * fVar275 + -fVar469 * fVar314;
      auVar241._8_4_ = -fVar428 * fVar276 + -fVar448 * fVar275 + -fVar472 * fVar314;
      auVar241._12_4_ = fVar276 * -0.0 + fVar275 * -0.0 + fVar314 * -0.0;
      auVar291 = rcpps(auVar294,auVar241);
      fVar489 = auVar291._0_4_;
      fVar207 = auVar291._4_4_;
      fVar263 = auVar291._8_4_;
      fVar282 = auVar291._12_4_;
      fVar489 = (((float)DAT_01f46a60 - auVar241._0_4_ * fVar489) * fVar489 + fVar489) *
                -((0.0 - fStack_574) * -fVar426 + auVar294._0_4_);
      fVar207 = ((DAT_01f46a60._4_4_ - auVar241._4_4_ * fVar207) * fVar207 + fVar207) *
                -((0.0 - fStack_570) * -fVar427 + auVar294._4_4_);
      fVar263 = ((DAT_01f46a60._8_4_ - auVar241._8_4_ * fVar263) * fVar263 + fVar263) *
                -((0.0 - fStack_56c) * -fVar428 + auVar294._8_4_);
      fVar282 = ((DAT_01f46a60._12_4_ - auVar241._12_4_ * fVar282) * fVar282 + fVar282) * 0.0;
      uVar365 = -(uint)(auVar241._0_4_ < 0.0 || ABS(auVar241._0_4_) < 1e-18);
      uVar366 = -(uint)(auVar241._4_4_ < 0.0 || ABS(auVar241._4_4_) < 1e-18);
      uVar367 = -(uint)(auVar241._8_4_ < 0.0 || ABS(auVar241._8_4_) < 1e-18);
      uVar147 = -(uint)(auVar241._12_4_ < 0.0 || ABS(auVar241._12_4_) < 1e-18);
      auVar440._0_8_ = CONCAT44(uVar366,uVar365) & 0xff800000ff800000;
      auVar440._8_4_ = uVar367 & 0xff800000;
      auVar440._12_4_ = uVar147 & 0xff800000;
      auVar183._0_4_ = ~uVar365 & (uint)fVar489;
      auVar183._4_4_ = ~uVar366 & (uint)fVar207;
      auVar183._8_4_ = ~uVar367 & (uint)fVar263;
      auVar183._12_4_ = ~uVar147 & (uint)fVar282;
      aVar271 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar356,auVar183 | auVar440);
      uVar365 = -(uint)(0.0 < auVar241._0_4_ || ABS(auVar241._0_4_) < 1e-18);
      uVar366 = -(uint)(0.0 < auVar241._4_4_ || ABS(auVar241._4_4_) < 1e-18);
      uVar367 = -(uint)(0.0 < auVar241._8_4_ || ABS(auVar241._8_4_) < 1e-18);
      uVar147 = -(uint)(0.0 < auVar241._12_4_ || ABS(auVar241._12_4_) < 1e-18);
      auVar184._0_8_ = CONCAT44(uVar366,uVar365) & 0x7f8000007f800000;
      auVar184._8_4_ = uVar367 & 0x7f800000;
      auVar184._12_4_ = uVar147 & 0x7f800000;
      auVar242._0_4_ = ~uVar365 & (uint)fVar489;
      auVar242._4_4_ = ~uVar366 & (uint)fVar207;
      auVar242._8_4_ = ~uVar367 & (uint)fVar263;
      auVar242._12_4_ = ~uVar147 & (uint)fVar282;
      aVar408 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar405,auVar242 | auVar184);
      fVar489 = aVar271.v[3];
      fVar207 = aVar271.v[0];
      fVar263 = aVar271.v[1];
      fVar282 = aVar271.v[2];
      auVar332._0_4_ = -(uint)(fVar207 <= aVar408.v[0]) & auVar346._0_4_;
      auVar332._4_4_ = -(uint)(fVar263 <= aVar408.v[1]) & auVar346._4_4_;
      auVar332._8_4_ = -(uint)(fVar282 <= aVar408.v[2]) & auVar346._8_4_;
      auVar332._12_4_ = -(uint)(fVar489 <= aVar408.v[3]) & auVar346._12_4_;
      iVar259 = movmskps(iVar259,auVar332);
      if (iVar259 != 0) {
        auVar356 = maxps(ZEXT816(0),_local_468);
        auVar85._4_4_ = fStack_204;
        auVar85._0_4_ = local_208;
        auVar85._8_4_ = fStack_200;
        auVar85._12_4_ = fStack_1fc;
        auVar291 = minps(auVar85,_DAT_01f46a60);
        auVar243._0_12_ = ZEXT812(0);
        auVar243._12_4_ = 0;
        auVar405 = maxps(auVar291,auVar243);
        auVar86._4_4_ = fStack_1f4;
        auVar86._0_4_ = local_1f8;
        auVar86._8_4_ = fStack_1f0;
        auVar86._12_4_ = fStack_1ec;
        auVar291 = minps(auVar86,_DAT_01f46a60);
        auVar291 = maxps(auVar291,auVar243);
        local_108[0] = (auVar405._0_4_ + 0.0) * 0.25 * fVar315 + fVar364;
        local_108[1] = (auVar405._4_4_ + 1.0) * 0.25 * fVar315 + fVar364;
        local_108[2] = (auVar405._8_4_ + 2.0) * 0.25 * fVar315 + fVar364;
        local_108[3] = (auVar405._12_4_ + 3.0) * 0.25 * fVar315 + fVar364;
        local_118[0] = (auVar291._0_4_ + 0.0) * 0.25 * fVar315 + fVar364;
        local_118[1] = (auVar291._4_4_ + 1.0) * 0.25 * fVar315 + fVar364;
        local_118[2] = (auVar291._8_4_ + 2.0) * 0.25 * fVar315 + fVar364;
        local_118[3] = (auVar291._12_4_ + 3.0) * 0.25 * fVar315 + fVar364;
        fVar286 = fVar286 - auVar356._0_4_ * auVar356._0_4_;
        fVar308 = fVar308 - auVar356._4_4_ * auVar356._4_4_;
        auVar185._4_4_ = fVar308;
        auVar185._0_4_ = fVar286;
        fVar311 = fVar311 - auVar356._8_4_ * auVar356._8_4_;
        fVar316 = fVar316 - auVar356._12_4_ * auVar356._12_4_;
        auVar185._8_4_ = fVar311;
        auVar185._12_4_ = fVar316;
        auVar272._0_4_ = fVar389 * fVar389 - fVar490 * 4.0 * fVar286;
        auVar272._4_4_ = fVar392 * fVar392 - fVar209 * 4.0 * fVar308;
        auVar272._8_4_ = fVar431 * fVar431 - fVar278 * 4.0 * fVar311;
        auVar272._12_4_ = fVar444 * fVar444 - fVar285 * 4.0 * fVar316;
        auVar423._4_4_ = -(uint)(0.0 <= auVar272._4_4_);
        auVar423._0_4_ = -(uint)(0.0 <= auVar272._0_4_);
        auVar423._8_4_ = -(uint)(0.0 <= auVar272._8_4_);
        auVar423._12_4_ = -(uint)(0.0 <= auVar272._12_4_);
        iVar259 = movmskps(iVar259,auVar423);
        if (iVar259 == 0) {
          _local_648 = ZEXT816(0);
          fVar288 = 0.0;
          fVar337 = 0.0;
          fVar339 = 0.0;
          fVar306 = 0.0;
          fVar214 = 0.0;
          fVar262 = 0.0;
          fVar279 = 0.0;
          fVar283 = 0.0;
          fVar490 = 0.0;
          fVar209 = 0.0;
          fVar278 = 0.0;
          fVar285 = 0.0;
          fVar315 = 0.0;
          fVar388 = 0.0;
          fVar391 = 0.0;
          fVar413 = 0.0;
          _local_5b8 = ZEXT816(0);
          iVar259 = 0;
          auVar186 = _DAT_01f45a40;
          auVar382 = _DAT_01f45a30;
        }
        else {
          auVar291 = sqrtps(_local_5b8,auVar272);
          auVar244._0_4_ = fVar490 + fVar490;
          auVar244._4_4_ = fVar209 + fVar209;
          auVar244._8_4_ = fVar278 + fVar278;
          auVar244._12_4_ = fVar285 + fVar285;
          auVar356 = rcpps(auVar185,auVar244);
          fVar416 = auVar356._0_4_;
          fVar417 = auVar356._4_4_;
          fVar426 = auVar356._8_4_;
          fVar427 = auVar356._12_4_;
          fVar416 = ((float)DAT_01f46a60 - auVar244._0_4_ * fVar416) * fVar416 + fVar416;
          fVar417 = (DAT_01f46a60._4_4_ - auVar244._4_4_ * fVar417) * fVar417 + fVar417;
          fVar426 = (DAT_01f46a60._8_4_ - auVar244._8_4_ * fVar426) * fVar426 + fVar426;
          fVar427 = (DAT_01f46a60._12_4_ - auVar244._12_4_ * fVar427) * fVar427 + fVar427;
          fVar428 = (-fVar389 - auVar291._0_4_) * fVar416;
          fVar430 = (-fVar392 - auVar291._4_4_) * fVar417;
          fVar443 = (-fVar431 - auVar291._8_4_) * fVar426;
          fVar449 = (-fVar444 - auVar291._12_4_) * fVar427;
          fVar416 = (auVar291._0_4_ - fVar389) * fVar416;
          fVar417 = (auVar291._4_4_ - fVar392) * fVar417;
          fVar426 = (auVar291._8_4_ - fVar431) * fVar426;
          fVar427 = (auVar291._12_4_ - fVar444) * fVar427;
          fVar389 = (fVar339 * fVar428 + fVar477) * fVar214;
          fVar392 = (fVar341 * fVar430 + fVar480) * fVar262;
          fVar431 = (fVar372 * fVar443 + fVar482) * fVar279;
          fVar444 = (fVar353 * fVar449 + fVar484) * fVar283;
          fVar490 = fVar276 * fVar428 - (fVar476 * fVar389 + local_578);
          fVar209 = fVar276 * fVar430 - (fVar479 * fVar392 + fStack_574);
          fVar278 = fVar276 * fVar443 - (fVar481 * fVar431 + fStack_570);
          fVar285 = fVar276 * fVar449 - (fVar483 * fVar444 + fStack_56c);
          fVar315 = fVar275 * fVar428 - (fVar337 * fVar389 + fVar288);
          fVar388 = fVar275 * fVar430 - (fVar340 * fVar392 + fVar306);
          fVar391 = fVar275 * fVar443 - (fVar351 * fVar431 + fVar309);
          fVar413 = fVar275 * fVar449 - (fVar385 * fVar444 + fVar312);
          local_5b8._4_4_ = fVar314 * fVar430 - (fVar392 * (float)local_5a8._4_4_ + fVar307);
          local_5b8._0_4_ = fVar314 * fVar428 - (fVar389 * (float)local_5a8._0_4_ + fVar289);
          fStack_5b0 = fVar314 * fVar443 - (fVar431 * fStack_5a0 + fVar310);
          fStack_5ac = fVar314 * fVar449 - (fVar444 * fStack_59c + fVar313);
          fVar214 = (fVar339 * fVar416 + fVar477) * fVar214;
          fVar262 = (fVar341 * fVar417 + fVar480) * fVar262;
          fVar279 = (fVar372 * fVar426 + fVar482) * fVar279;
          fVar283 = (fVar353 * fVar427 + fVar484) * fVar283;
          local_648._4_4_ = fVar276 * fVar417 - (fVar479 * fVar262 + fStack_574);
          local_648._0_4_ = fVar276 * fVar416 - (fVar476 * fVar214 + local_578);
          fStack_640 = fVar276 * fVar426 - (fVar481 * fVar279 + fStack_570);
          fStack_63c = fVar276 * fVar427 - (fVar483 * fVar283 + fStack_56c);
          fVar288 = fVar275 * fVar416 - (fVar337 * fVar214 + fVar288);
          fVar337 = fVar275 * fVar417 - (fVar340 * fVar262 + fVar306);
          fVar339 = fVar275 * fVar426 - (fVar351 * fVar279 + fVar309);
          fVar306 = fVar275 * fVar427 - (fVar385 * fVar283 + fVar312);
          bVar142 = 0.0 <= auVar272._0_4_;
          uVar365 = -(uint)bVar142;
          bVar32 = 0.0 <= auVar272._4_4_;
          uVar366 = -(uint)bVar32;
          bVar33 = 0.0 <= auVar272._8_4_;
          uVar367 = -(uint)bVar33;
          bVar34 = 0.0 <= auVar272._12_4_;
          uVar147 = -(uint)bVar34;
          fVar214 = fVar314 * fVar416 - (fVar214 * (float)local_5a8._0_4_ + fVar289);
          fVar262 = fVar314 * fVar417 - (fVar262 * (float)local_5a8._4_4_ + fVar307);
          fVar279 = fVar314 * fVar426 - (fVar279 * fStack_5a0 + fVar310);
          fVar283 = fVar314 * fVar427 - (fVar283 * fStack_59c + fVar313);
          auVar273._0_4_ = (uint)fVar428 & uVar365;
          auVar273._4_4_ = (uint)fVar430 & uVar366;
          auVar273._8_4_ = (uint)fVar443 & uVar367;
          auVar273._12_4_ = (uint)fVar449 & uVar147;
          auVar382._0_8_ = CONCAT44(~uVar366,~uVar365) & 0x7f8000007f800000;
          auVar382._8_4_ = ~uVar367 & 0x7f800000;
          auVar382._12_4_ = ~uVar147 & 0x7f800000;
          auVar382 = auVar382 | auVar273;
          auVar359._0_4_ = (uint)fVar416 & uVar365;
          auVar359._4_4_ = (uint)fVar417 & uVar366;
          auVar359._8_4_ = (uint)fVar426 & uVar367;
          auVar359._12_4_ = (uint)fVar427 & uVar147;
          auVar186._0_8_ = CONCAT44(~uVar366,~uVar365) & 0xff800000ff800000;
          auVar186._8_4_ = ~uVar367 & 0xff800000;
          auVar186._12_4_ = ~uVar147 & 0xff800000;
          auVar186 = auVar186 | auVar359;
          auVar84._4_4_ = fVar371;
          auVar84._0_4_ = fVar352;
          auVar84._8_4_ = fVar429;
          auVar84._12_4_ = fVar445;
          auVar82._8_4_ = fVar474;
          auVar82._0_8_ = CONCAT44(fVar473,fVar470) & 0x7fffffff7fffffff;
          auVar82._12_4_ = fVar475;
          auVar356 = maxps(auVar84,auVar82);
          fVar289 = auVar356._0_4_ * 1.9073486e-06;
          fVar307 = auVar356._4_4_ * 1.9073486e-06;
          fVar340 = auVar356._8_4_ * 1.9073486e-06;
          fVar341 = auVar356._12_4_ * 1.9073486e-06;
          auVar360._0_4_ = -(uint)(fVar354 < fVar289 && bVar142);
          auVar360._4_4_ = -(uint)(fVar394 < fVar307 && bVar32);
          auVar360._8_4_ = -(uint)(fVar415 < fVar340 && bVar33);
          auVar360._12_4_ = -(uint)(fVar386 < fVar341 && bVar34);
          iVar259 = movmskps(iVar259,auVar360);
          if (iVar259 != 0) {
            uVar365 = -(uint)(fVar286 <= 0.0);
            uVar366 = -(uint)(fVar308 <= 0.0);
            uVar367 = -(uint)(fVar311 <= 0.0);
            uVar147 = -(uint)(fVar316 <= 0.0);
            auVar410._0_4_ = (uVar365 & 0xff800000 | ~uVar365 & 0x7f800000) & auVar360._0_4_;
            auVar410._4_4_ = (uVar366 & 0xff800000 | ~uVar366 & 0x7f800000) & auVar360._4_4_;
            auVar410._8_4_ = (uVar367 & 0xff800000 | ~uVar367 & 0x7f800000) & auVar360._8_4_;
            auVar410._12_4_ = (uVar147 & 0xff800000 | ~uVar147 & 0x7f800000) & auVar360._12_4_;
            auVar441._0_4_ = ~auVar360._0_4_ & auVar382._0_4_;
            auVar441._4_4_ = ~auVar360._4_4_ & auVar382._4_4_;
            auVar441._8_4_ = ~auVar360._8_4_ & auVar382._8_4_;
            auVar441._12_4_ = ~auVar360._12_4_ & auVar382._12_4_;
            auVar383._0_4_ = (uVar365 & 0x7f800000 | ~uVar365 & 0xff800000) & auVar360._0_4_;
            auVar383._4_4_ = (uVar366 & 0x7f800000 | ~uVar366 & 0xff800000) & auVar360._4_4_;
            auVar383._8_4_ = (uVar367 & 0x7f800000 | ~uVar367 & 0xff800000) & auVar360._8_4_;
            auVar383._12_4_ = (uVar147 & 0x7f800000 | ~uVar147 & 0xff800000) & auVar360._12_4_;
            auVar363._0_4_ = ~auVar360._0_4_ & auVar186._0_4_;
            auVar363._4_4_ = ~auVar360._4_4_ & auVar186._4_4_;
            auVar363._8_4_ = ~auVar360._8_4_ & auVar186._8_4_;
            auVar363._12_4_ = ~auVar360._12_4_ & auVar186._12_4_;
            auVar423._4_4_ = -(uint)((fVar307 <= fVar394 || fVar308 <= 0.0) && bVar32);
            auVar423._0_4_ = -(uint)((fVar289 <= fVar354 || fVar286 <= 0.0) && bVar142);
            auVar423._8_4_ = -(uint)((fVar340 <= fVar415 || fVar311 <= 0.0) && bVar33);
            auVar423._12_4_ = -(uint)((fVar341 <= fVar386 || fVar316 <= 0.0) && bVar34);
            auVar186 = auVar363 | auVar383;
            auVar382 = auVar441 | auVar410;
          }
        }
        auVar356 = minps((undefined1  [16])aVar408,auVar382);
        _local_5a8 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     maxps((undefined1  [16])aVar271,auVar186);
        tp1.lower.field_0 = _local_5a8;
        tp1.upper.field_0 = aVar408;
        auVar347._0_4_ = -(uint)(fVar207 <= auVar356._0_4_) & auVar332._0_4_;
        auVar347._4_4_ = -(uint)(fVar263 <= auVar356._4_4_) & auVar332._4_4_;
        auVar347._8_4_ = -(uint)(fVar282 <= auVar356._8_4_) & auVar332._8_4_;
        auVar347._12_4_ = -(uint)(fVar489 <= auVar356._12_4_) & auVar332._12_4_;
        auVar187._0_4_ = -(uint)(local_5a8._0_4_ <= aVar408.v[0]) & auVar332._0_4_;
        auVar187._4_4_ = -(uint)(local_5a8._4_4_ <= aVar408.v[1]) & auVar332._4_4_;
        auVar187._8_4_ = -(uint)(local_5a8._8_4_ <= aVar408.v[2]) & auVar332._8_4_;
        auVar187._12_4_ = -(uint)(local_5a8._12_4_ <= aVar408.v[3]) & auVar332._12_4_;
        iVar259 = movmskps(iVar259,auVar187 | auVar347);
        lVar135 = CONCAT44((int)((ulong)pSVar133 >> 0x20),iVar259);
        _local_588 = aVar271;
        if (iVar259 != 0) {
          local_5b8._0_4_ =
               -(uint)((int)uVar355 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_5b8._0_4_ * fVar314 +
                                                 fVar315 * fVar275 + fVar490 * fVar276)) &
                             auVar423._0_4_) << 0x1f) >> 0x1f) + 4);
          local_5b8._4_4_ =
               -(uint)((int)uVar355 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_5b8._4_4_ * fVar314 +
                                                 fVar388 * fVar275 + fVar209 * fVar276)) &
                             auVar423._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_5b0 = (float)-(uint)((int)uVar355 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_5b0 * fVar314 +
                                                                fVar391 * fVar275 +
                                                                fVar278 * fVar276)) & auVar423._8_4_
                                            ) << 0x1f) >> 0x1f) + 4);
          fStack_5ac = (float)-(uint)((int)uVar355 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_5ac * fVar314 +
                                                                fVar413 * fVar275 +
                                                                fVar285 * fVar276)) &
                                            auVar423._12_4_) << 0x1f) >> 0x1f) + 4);
          auVar188 = ~_local_5b8 & auVar347;
          fVar490 = local_598 + fVar207;
          fVar209 = fStack_594 + fVar263;
          fVar278 = fStack_590 + fVar282;
          fVar285 = fStack_58c + fVar489;
          while( true ) {
            local_328 = auVar188;
            uVar131 = (undefined4)((ulong)lVar135 >> 0x20);
            iVar259 = movmskps((int)lVar135,auVar188);
            lVar135 = CONCAT44(uVar131,iVar259);
            if (iVar259 == 0) break;
            auVar291 = ~auVar188 & _DAT_01f45a30 | auVar188 & (undefined1  [16])_local_588;
            auVar295._4_4_ = auVar291._0_4_;
            auVar295._0_4_ = auVar291._4_4_;
            auVar295._8_4_ = auVar291._12_4_;
            auVar295._12_4_ = auVar291._8_4_;
            auVar356 = minps(auVar295,auVar291);
            auVar245._0_8_ = auVar356._8_8_;
            auVar245._8_4_ = auVar356._0_4_;
            auVar245._12_4_ = auVar356._4_4_;
            auVar356 = minps(auVar245,auVar356);
            auVar246._0_8_ =
                 CONCAT44(-(uint)(auVar356._4_4_ == auVar291._4_4_) & auVar188._4_4_,
                          -(uint)(auVar356._0_4_ == auVar291._0_4_) & auVar188._0_4_);
            auVar246._8_4_ = -(uint)(auVar356._8_4_ == auVar291._8_4_) & auVar188._8_4_;
            auVar246._12_4_ = -(uint)(auVar356._12_4_ == auVar291._12_4_) & auVar188._12_4_;
            iVar259 = movmskps(iVar259,auVar246);
            if (iVar259 != 0) {
              auVar188._8_4_ = auVar246._8_4_;
              auVar188._0_8_ = auVar246._0_8_;
              auVar188._12_4_ = auVar246._12_4_;
            }
            uVar130 = movmskps(iVar259,auVar188);
            uVar140 = CONCAT44(uVar131,uVar130);
            lVar135 = 0;
            if (uVar140 != 0) {
              for (; (uVar140 >> lVar135 & 1) == 0; lVar135 = lVar135 + 1) {
              }
            }
            *(undefined4 *)(local_328 + lVar135 * 4) = 0;
            auVar76._4_4_ = fStack_564;
            auVar76._0_4_ = local_568;
            auVar76._8_4_ = fStack_560;
            auVar76._12_4_ = fStack_55c;
            auVar80._4_4_ = fVar277;
            auVar80._0_4_ = fVar478;
            auVar80._8_4_ = fVar281;
            auVar80._12_4_ = fVar284;
            auVar291 = minps(auVar76,auVar80);
            auVar405 = maxps(auVar76,auVar80);
            auVar78._4_4_ = fVar451;
            auVar78._0_4_ = fVar287;
            auVar78._8_4_ = fVar464;
            auVar78._12_4_ = fVar468;
            auVar356 = minps(auVar78,_local_6a8);
            auVar291 = minps(auVar291,auVar356);
            auVar356 = maxps(auVar78,_local_6a8);
            auVar405 = maxps(auVar405,auVar356);
            auVar296._0_8_ = auVar291._0_8_ & 0x7fffffff7fffffff;
            auVar296._8_4_ = auVar291._8_4_ & 0x7fffffff;
            auVar296._12_4_ = auVar291._12_4_ & 0x7fffffff;
            auVar189._0_8_ = auVar405._0_8_ & 0x7fffffff7fffffff;
            auVar189._8_4_ = auVar405._8_4_ & 0x7fffffff;
            auVar189._12_4_ = ABS(auVar405._12_4_);
            auVar356 = maxps(auVar296,auVar189);
            fVar286 = auVar356._4_4_;
            if (auVar356._4_4_ <= auVar356._0_4_) {
              fVar286 = auVar356._0_4_;
            }
            auVar297._8_8_ = auVar356._8_8_;
            auVar297._0_8_ = auVar356._8_8_;
            if (auVar356._8_4_ <= fVar286) {
              auVar297._0_4_ = fVar286;
            }
            fVar311 = auVar297._0_4_ * 1.9073486e-06;
            fVar286 = local_108[lVar135];
            fVar308 = local_118[lVar135 + -8];
            for (uVar140 = 0; uVar140 != 5; uVar140 = uVar140 + 1) {
              fVar289 = SQRT(fVar338) * 1.9073486e-06 * fVar308;
              fVar316 = 1.0 - fVar286;
              fVar307 = fVar286 * fVar316;
              fVar309 = fVar316 * fVar316 * fVar316;
              fVar341 = fVar286 * fVar286 * fVar286;
              fVar310 = fVar309 * 0.16666667;
              fVar340 = (fVar316 * fVar307 * 12.0 + fVar307 * fVar286 * 6.0 +
                        fVar309 * 4.0 + fVar341) * 0.16666667;
              fVar309 = (fVar307 * fVar286 * 12.0 + fVar316 * fVar307 * 6.0 +
                        fVar341 * 4.0 + fVar309) * 0.16666667;
              fVar341 = fVar341 * 0.16666667;
              local_578 = fVar310 * local_568 +
                          fVar340 * fVar478 + fVar309 * fVar287 + fVar341 * (float)local_6a8._0_4_;
              fStack_574 = fVar310 * fStack_564 +
                           fVar340 * fVar277 + fVar309 * fVar451 + fVar341 * (float)local_6a8._4_4_;
              fStack_570 = fVar310 * fStack_560 +
                           fVar340 * fVar281 + fVar309 * fVar464 + fVar341 * fStack_6a0;
              fStack_56c = fVar310 * fStack_55c +
                           fVar340 * fVar284 + fVar309 * fVar468 + fVar341 * fStack_69c;
              fVar309 = -fVar316 * fVar316 * 0.5;
              fVar340 = (-fVar286 * fVar286 - fVar307 * 4.0) * 0.5;
              fVar341 = (fVar316 * fVar316 + fVar307 * 4.0) * 0.5;
              fVar307 = fVar286 * fVar286 * 0.5;
              fVar372 = fVar309 * local_568 +
                        fVar340 * fVar478 + fVar341 * fVar287 + fVar307 * (float)local_6a8._0_4_;
              fVar312 = fVar309 * fStack_564 +
                        fVar340 * fVar277 + fVar341 * fVar451 + fVar307 * (float)local_6a8._4_4_;
              fVar313 = fVar309 * fStack_560 +
                        fVar340 * fVar281 + fVar341 * fVar464 + fVar307 * fStack_6a0;
              fVar385 = fVar309 * fStack_55c +
                        fVar340 * fVar284 + fVar341 * fVar468 + fVar307 * fStack_69c;
              fVar340 = fVar286 - (fVar316 + fVar316);
              fVar307 = fVar316 - (fVar286 + fVar286);
              fVar309 = fVar316 * local_568 +
                        fVar340 * fVar478 + fVar307 * fVar287 + (float)local_6a8._0_4_ * fVar286;
              fVar310 = fVar316 * fStack_564 +
                        fVar340 * fVar277 + fVar307 * fVar451 + (float)local_6a8._4_4_ * fVar286;
              fVar351 = fVar316 * fStack_560 +
                        fVar340 * fVar281 + fVar307 * fVar464 + fStack_6a0 * fVar286;
              fVar307 = (fVar308 * fVar206 + 0.0) - local_578;
              fVar340 = (fVar308 * fVar275 + 0.0) - fStack_574;
              fVar341 = (fVar308 * fVar314 + 0.0) - fStack_570;
              fVar353 = (fVar308 * 0.0 + 0.0) - fStack_56c;
              fVar316 = fVar340 * fVar340;
              fStack_610 = fVar341 * fVar341;
              fStack_60c = fVar353 * fVar353;
              local_618._0_4_ = fVar316 + fVar307 * fVar307 + fStack_610;
              local_618._4_4_ = fVar316 + fVar316 + fStack_60c;
              fStack_610 = fVar316 + fStack_610 + fStack_610;
              fStack_60c = fVar316 + fStack_60c + fStack_60c;
              fVar316 = fVar311;
              if (fVar311 <= fVar289) {
                fVar316 = fVar289;
              }
              fVar315 = fVar312 * fVar312 + fVar372 * fVar372 + fVar313 * fVar313;
              auVar291 = ZEXT416((uint)fVar315);
              auVar356 = rsqrtss(ZEXT416((uint)fVar315),auVar291);
              fVar289 = auVar356._0_4_;
              fVar388 = fVar289 * 1.5 - fVar289 * fVar289 * fVar315 * 0.5 * fVar289;
              fVar413 = fVar372 * fVar388;
              fVar415 = fVar312 * fVar388;
              fVar416 = fVar313 * fVar388;
              fVar386 = fVar385 * fVar388;
              fVar431 = fVar351 * fVar313 + fVar310 * fVar312 + fVar309 * fVar372;
              auVar356 = rcpss(auVar291,auVar291);
              fVar289 = (2.0 - fVar315 * auVar356._0_4_) * auVar356._0_4_;
              fVar354 = fVar340 * fVar415;
              fVar391 = fVar341 * fVar416;
              fVar394 = fVar353 * fVar386;
              fVar389 = fVar354 + fVar307 * fVar413 + fVar391;
              fVar392 = fVar354 + fVar354 + fVar394;
              fVar391 = fVar354 + fVar391 + fVar391;
              fVar394 = fVar354 + fVar394 + fVar394;
              fVar444 = (SQRT((float)local_618._0_4_) + 1.0) * (fVar311 / SQRT(fVar315)) +
                        SQRT((float)local_618._0_4_) * fVar311 + fVar316;
              fVar354 = fVar386 * -fVar385;
              fVar310 = fVar416 * -fVar313 + fVar415 * -fVar312 + fVar413 * -fVar372 +
                        fVar289 * (fVar315 * fVar351 - fVar431 * fVar313) * fVar388 * fVar341 +
                        fVar289 * (fVar315 * fVar310 - fVar431 * fVar312) * fVar388 * fVar340 +
                        fVar289 * (fVar315 * fVar309 - fVar431 * fVar372) * fVar388 * fVar307;
              fVar315 = fVar314 * fVar416 + fVar275 * fVar415 + fVar206 * fVar413;
              fVar289 = (float)local_618._0_4_ - fVar389 * fVar389;
              auVar190._0_8_ = CONCAT44((float)local_618._4_4_ - fVar392 * fVar392,fVar289);
              auVar190._8_4_ = fStack_610 - fVar391 * fVar391;
              auVar190._12_4_ = fStack_60c - fVar394 * fVar394;
              fVar351 = -fVar385 * fVar353;
              local_668 = CONCAT44(fVar354,fVar310);
              auVar247._8_4_ = auVar190._8_4_;
              auVar247._0_8_ = auVar190._0_8_;
              auVar247._12_4_ = auVar190._12_4_;
              auVar356 = rsqrtss(auVar247,auVar190);
              fVar309 = auVar356._0_4_;
              fVar309 = fVar309 * 1.5 - fVar309 * fVar309 * fVar289 * 0.5 * fVar309;
              if (fVar289 < 0.0) {
                fVar289 = sqrtf(fVar289);
                lVar135 = extraout_RAX;
                uVar138 = extraout_RDX;
              }
              else {
                fVar289 = SQRT(fVar289);
              }
              fVar289 = fVar289 - fStack_56c;
              fVar388 = ((-fVar313 * fVar341 + -fVar312 * fVar340 + -fVar372 * fVar307) -
                        fVar389 * fVar310) * fVar309 - fVar385;
              fVar309 = ((fVar314 * fVar341 + fVar275 * fVar340 + fVar206 * fVar307) -
                        fVar389 * fVar315) * fVar309;
              auVar298._0_4_ = fVar310 * fVar309 - fVar315 * fVar388;
              auVar362._8_4_ = -fVar351;
              auVar362._0_8_ = CONCAT44(fVar351,fVar388) ^ 0x8000000000000000;
              auVar362._12_4_ = fVar353 * 0.0;
              auVar361._8_8_ = auVar362._8_8_;
              auVar361._0_8_ = CONCAT44(fVar309,fVar388) ^ 0x80000000;
              auVar298._4_4_ = auVar298._0_4_;
              auVar298._8_4_ = auVar298._0_4_;
              auVar298._12_4_ = auVar298._0_4_;
              auVar356 = divps(auVar361,auVar298);
              auVar370._8_4_ = fVar354;
              auVar370._0_8_ = local_668;
              auVar370._12_4_ = -(fVar386 * 0.0);
              auVar369._8_8_ = auVar370._8_8_;
              auVar369._0_8_ = CONCAT44(fVar315,fVar310) ^ 0x8000000000000000;
              auVar291 = divps(auVar369,auVar298);
              fVar308 = fVar308 - (fVar289 * auVar291._0_4_ + fVar389 * auVar356._0_4_);
              fVar286 = fVar286 - (fVar289 * auVar291._4_4_ + fVar389 * auVar356._4_4_);
              if ((ABS(fVar389) < fVar444) &&
                 (ABS(fVar289) < auVar405._12_4_ * 1.9073486e-06 + fVar316 + fVar444)) {
                bVar142 = uVar140 < 5;
                fVar308 = fVar467 + fVar308;
                if ((fVar308 < fVar280) ||
                   (fVar311 = *(float *)(ray + k * 4 + 0x80), fVar311 < fVar308)) {
                  lVar135 = 0;
                }
                else {
                  lVar135 = 0;
                  if ((0.0 <= fVar286) && (fVar286 <= 1.0)) {
                    auVar356 = rsqrtss(_local_618,_local_618);
                    fVar316 = auVar356._0_4_;
                    pGVar27 = (context->scene->geometries).items[uVar139].ptr;
                    if ((pGVar27->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                      lVar135 = 0;
                      pRVar136 = (RTCIntersectArguments *)context;
                      uVar138 = uVar139;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (lVar135 = CONCAT71((int7)((ulong)context->args >> 8),1),
                            pRVar136 = (RTCIntersectArguments *)context, uVar138 = uVar139,
                            pGVar27->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      fVar316 = fVar316 * 1.5 +
                                fVar316 * fVar316 * (float)local_618._0_4_ * -0.5 * fVar316;
                      fVar307 = fVar307 * fVar316;
                      fVar340 = fVar340 * fVar316;
                      fVar341 = fVar341 * fVar316;
                      fVar316 = fVar385 * fVar307 + fVar372;
                      fVar289 = fVar385 * fVar340 + fVar312;
                      fVar309 = fVar385 * fVar341 + fVar313;
                      fVar310 = fVar340 * fVar372 - fVar312 * fVar307;
                      fVar340 = fVar341 * fVar312 - fVar313 * fVar340;
                      fVar307 = fVar307 * fVar313 - fVar372 * fVar341;
                      local_2f8 = fVar340 * fVar289 - fVar307 * fVar316;
                      local_318._4_4_ = fVar307 * fVar309 - fVar310 * fVar289;
                      local_308 = fVar310 * fVar316 - fVar340 * fVar309;
                      local_318._0_4_ = local_318._4_4_;
                      fStack_310 = (float)local_318._4_4_;
                      fStack_30c = (float)local_318._4_4_;
                      fStack_304 = local_308;
                      fStack_300 = local_308;
                      fStack_2fc = local_308;
                      fStack_2f4 = local_2f8;
                      fStack_2f0 = local_2f8;
                      fStack_2ec = local_2f8;
                      local_2e8 = fVar286;
                      fStack_2e4 = fVar286;
                      fStack_2e0 = fVar286;
                      fStack_2dc = fVar286;
                      local_2d8 = 0;
                      uStack_2d4 = 0;
                      uStack_2d0 = 0;
                      uStack_2cc = 0;
                      local_2c8 = CONCAT44(uVar145,uVar145);
                      uStack_2c0 = CONCAT44(uVar145,uVar145);
                      local_2b8 = CONCAT44(uVar144,uVar144);
                      uStack_2b0 = CONCAT44(uVar144,uVar144);
                      local_2a8 = context->user->instID[0];
                      uStack_2a4 = local_2a8;
                      uStack_2a0 = local_2a8;
                      uStack_29c = local_2a8;
                      local_298 = context->user->instPrimID[0];
                      uStack_294 = local_298;
                      uStack_290 = local_298;
                      uStack_28c = local_298;
                      *(float *)(ray + k * 4 + 0x80) = fVar308;
                      local_5c8 = *(undefined1 (*) [16])
                                   (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                      args.valid = (int *)local_5c8;
                      args.geometryUserPtr = pGVar27->userPtr;
                      args.context = context->user;
                      args.ray = (RTCRayN *)ray;
                      args.hit = (RTCHitN *)local_318;
                      args.N = 4;
                      p_Var31 = pGVar27->occlusionFilterN;
                      auVar491._8_8_ = &local_2a8;
                      auVar491._0_8_ = p_Var31;
                      pRVar136 = (RTCIntersectArguments *)context;
                      if (p_Var31 != (RTCFilterFunctionN)0x0) {
                        auVar491 = (*p_Var31)(&args);
                      }
                      uVar138 = auVar491._8_8_;
                      auVar248._0_4_ = -(uint)(local_5c8._0_4_ == 0);
                      auVar248._4_4_ = -(uint)(local_5c8._4_4_ == 0);
                      auVar248._8_4_ = -(uint)(local_5c8._8_4_ == 0);
                      auVar248._12_4_ = -(uint)(local_5c8._12_4_ == 0);
                      uVar365 = movmskps(auVar491._0_4_,auVar248);
                      pRVar134 = (RTCRayN *)(ulong)(uVar365 ^ 0xf);
                      if ((uVar365 ^ 0xf) == 0) {
                        auVar248 = auVar248 ^ _DAT_01f46b70;
                      }
                      else {
                        pRVar136 = context->args;
                        if (((RTCIntersectArguments *)pRVar136->filter !=
                             (RTCIntersectArguments *)0x0) &&
                           ((((ulong)*(Scene **)&pRVar136->flags & 2) != 0 ||
                            (((pGVar27->field_8).field_0x2 & 0x40) != 0)))) {
                          (*(code *)pRVar136->filter)(&args);
                          uVar138 = extraout_RDX_00;
                        }
                        auVar191._0_4_ = -(uint)(local_5c8._0_4_ == 0);
                        auVar191._4_4_ = -(uint)(local_5c8._4_4_ == 0);
                        auVar191._8_4_ = -(uint)(local_5c8._8_4_ == 0);
                        auVar191._12_4_ = -(uint)(local_5c8._12_4_ == 0);
                        auVar248 = auVar191 ^ _DAT_01f46b70;
                        *(undefined1 (*) [16])(args.ray + 0x80) =
                             ~auVar191 & _DAT_01f45a40 |
                             *(undefined1 (*) [16])(args.ray + 0x80) & auVar191;
                        pRVar134 = args.ray;
                      }
                      auVar249._0_4_ = auVar248._0_4_ << 0x1f;
                      auVar249._4_4_ = auVar248._4_4_ << 0x1f;
                      auVar249._8_4_ = auVar248._8_4_ << 0x1f;
                      auVar249._12_4_ = auVar248._12_4_ << 0x1f;
                      iVar259 = movmskps((int)pRVar134,auVar249);
                      lVar135 = CONCAT71((int7)(CONCAT44((int)((ulong)pRVar134 >> 0x20),iVar259) >>
                                               8),iVar259 != 0);
                      if (iVar259 == 0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar311;
                      }
                    }
                  }
                }
                goto LAB_0037fad7;
              }
            }
            bVar142 = false;
LAB_0037fad7:
            bVar141 = bVar141 | bVar142 & (byte)lVar135;
            fVar447 = *(float *)(ray + k * 4 + 0x80);
            auVar188._0_4_ = -(uint)(fVar490 <= fVar447) & local_328._0_4_;
            auVar188._4_4_ = -(uint)(fVar209 <= fVar447) & local_328._4_4_;
            auVar188._8_4_ = -(uint)(fVar278 <= fVar447) & local_328._8_4_;
            auVar188._12_4_ = -(uint)(fVar285 <= fVar447) & local_328._12_4_;
          }
          local_5a8._0_4_ = -(uint)((float)local_5a8._0_4_ + local_598 <= fVar447) & auVar187._0_4_;
          local_5a8._4_4_ = -(uint)((float)local_5a8._4_4_ + fStack_594 <= fVar447) & auVar187._4_4_
          ;
          fStack_5a0 = (float)(-(uint)(fStack_5a0 + fStack_590 <= fVar447) & auVar187._8_4_);
          fStack_59c = (float)(-(uint)(fStack_59c + fStack_58c <= fVar447) & auVar187._12_4_);
          auVar192._0_4_ =
               -(uint)((int)uVar355 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_648._0_4_ * fVar276 +
                                                 fVar288 * fVar275 + fVar214 * fVar314)) &
                             auVar423._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar192._4_4_ =
               -(uint)((int)uVar355 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_648._4_4_ * fVar276 +
                                                 fVar337 * fVar275 + fVar262 * fVar314)) &
                             auVar423._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar192._8_4_ =
               -(uint)((int)uVar355 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_640 * fVar276 +
                                                 fVar339 * fVar275 + fVar279 * fVar314)) &
                             auVar423._8_4_) << 0x1f) >> 0x1f) + 4);
          auVar192._12_4_ =
               -(uint)((int)uVar355 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_63c * fVar276 +
                                                 fVar306 * fVar275 + fVar283 * fVar314)) &
                             auVar423._12_4_) << 0x1f) >> 0x1f) + 4);
          auVar193 = ~auVar192 & (undefined1  [16])_local_5a8;
          _local_588 = tp1.lower.field_0;
          fVar490 = local_598 + tp1.lower.field_0.v[0];
          fVar209 = fStack_594 + tp1.lower.field_0.v[1];
          fVar214 = fStack_590 + tp1.lower.field_0.v[2];
          fVar262 = fStack_58c + tp1.lower.field_0.v[3];
          while( true ) {
            local_338 = auVar193;
            iVar259 = movmskps((int)lVar135,auVar193);
            if (iVar259 == 0) break;
            auVar291 = ~auVar193 & _DAT_01f45a30 | auVar193 & (undefined1  [16])_local_588;
            auVar299._4_4_ = auVar291._0_4_;
            auVar299._0_4_ = auVar291._4_4_;
            auVar299._8_4_ = auVar291._12_4_;
            auVar299._12_4_ = auVar291._8_4_;
            auVar356 = minps(auVar299,auVar291);
            auVar250._0_8_ = auVar356._8_8_;
            auVar250._8_4_ = auVar356._0_4_;
            auVar250._12_4_ = auVar356._4_4_;
            auVar356 = minps(auVar250,auVar356);
            auVar251._0_8_ =
                 CONCAT44(-(uint)(auVar356._4_4_ == auVar291._4_4_) & auVar193._4_4_,
                          -(uint)(auVar356._0_4_ == auVar291._0_4_) & auVar193._0_4_);
            auVar251._8_4_ = -(uint)(auVar356._8_4_ == auVar291._8_4_) & auVar193._8_4_;
            auVar251._12_4_ = -(uint)(auVar356._12_4_ == auVar291._12_4_) & auVar193._12_4_;
            iVar259 = movmskps(iVar259,auVar251);
            if (iVar259 != 0) {
              auVar193._8_4_ = auVar251._8_4_;
              auVar193._0_8_ = auVar251._0_8_;
              auVar193._12_4_ = auVar251._12_4_;
            }
            uVar131 = movmskps(iVar259,auVar193);
            uVar140 = CONCAT44((int)((ulong)lVar135 >> 0x20),uVar131);
            lVar135 = 0;
            if (uVar140 != 0) {
              for (; (uVar140 >> lVar135 & 1) == 0; lVar135 = lVar135 + 1) {
              }
            }
            *(undefined4 *)(local_338 + lVar135 * 4) = 0;
            auVar77._4_4_ = fStack_564;
            auVar77._0_4_ = local_568;
            auVar77._8_4_ = fStack_560;
            auVar77._12_4_ = fStack_55c;
            auVar81._4_4_ = fVar277;
            auVar81._0_4_ = fVar478;
            auVar81._8_4_ = fVar281;
            auVar81._12_4_ = fVar284;
            auVar291 = minps(auVar77,auVar81);
            auVar405 = maxps(auVar77,auVar81);
            auVar79._4_4_ = fVar451;
            auVar79._0_4_ = fVar287;
            auVar79._8_4_ = fVar464;
            auVar79._12_4_ = fVar468;
            auVar356 = minps(auVar79,_local_6a8);
            auVar291 = minps(auVar291,auVar356);
            auVar356 = maxps(auVar79,_local_6a8);
            auVar405 = maxps(auVar405,auVar356);
            auVar300._0_8_ = auVar291._0_8_ & 0x7fffffff7fffffff;
            auVar300._8_4_ = auVar291._8_4_ & 0x7fffffff;
            auVar300._12_4_ = auVar291._12_4_ & 0x7fffffff;
            auVar194._0_8_ = auVar405._0_8_ & 0x7fffffff7fffffff;
            auVar194._8_4_ = auVar405._8_4_ & 0x7fffffff;
            auVar194._12_4_ = ABS(auVar405._12_4_);
            auVar356 = maxps(auVar300,auVar194);
            fVar278 = auVar356._4_4_;
            if (auVar356._4_4_ <= auVar356._0_4_) {
              fVar278 = auVar356._0_4_;
            }
            auVar301._8_8_ = auVar356._8_8_;
            auVar301._0_8_ = auVar356._8_8_;
            if (auVar356._8_4_ <= fVar278) {
              auVar301._0_4_ = fVar278;
            }
            fVar285 = auVar301._0_4_ * 1.9073486e-06;
            fVar278 = local_118[lVar135];
            fVar279 = tp1.upper.field_0.v[lVar135];
            for (uVar140 = 0; uVar140 != 5; uVar140 = uVar140 + 1) {
              fVar286 = SQRT(fVar338) * 1.9073486e-06 * fVar279;
              fVar283 = 1.0 - fVar278;
              fVar308 = fVar278 * fVar283;
              fVar288 = fVar283 * fVar283 * fVar283;
              fVar316 = fVar278 * fVar278 * fVar278;
              fVar289 = fVar288 * 0.16666667;
              fVar311 = (fVar283 * fVar308 * 12.0 + fVar308 * fVar278 * 6.0 +
                        fVar288 * 4.0 + fVar316) * 0.16666667;
              fVar288 = (fVar308 * fVar278 * 12.0 + fVar283 * fVar308 * 6.0 +
                        fVar316 * 4.0 + fVar288) * 0.16666667;
              fVar316 = fVar316 * 0.16666667;
              local_578 = fVar289 * local_568 +
                          fVar311 * fVar478 + fVar288 * fVar287 + fVar316 * (float)local_6a8._0_4_;
              fStack_574 = fVar289 * fStack_564 +
                           fVar311 * fVar277 + fVar288 * fVar451 + fVar316 * (float)local_6a8._4_4_;
              fStack_570 = fVar289 * fStack_560 +
                           fVar311 * fVar281 + fVar288 * fVar464 + fVar316 * fStack_6a0;
              fStack_56c = fVar289 * fStack_55c +
                           fVar311 * fVar284 + fVar288 * fVar468 + fVar316 * fStack_69c;
              fVar288 = -fVar283 * fVar283 * 0.5;
              fVar311 = (-fVar278 * fVar278 - fVar308 * 4.0) * 0.5;
              fVar316 = (fVar283 * fVar283 + fVar308 * 4.0) * 0.5;
              fVar308 = fVar278 * fVar278 * 0.5;
              fVar339 = fVar288 * local_568 +
                        fVar311 * fVar478 + fVar316 * fVar287 + fVar308 * (float)local_6a8._0_4_;
              fVar306 = fVar288 * fStack_564 +
                        fVar311 * fVar277 + fVar316 * fVar451 + fVar308 * (float)local_6a8._4_4_;
              fVar307 = fVar288 * fStack_560 +
                        fVar311 * fVar281 + fVar316 * fVar464 + fVar308 * fStack_6a0;
              fVar340 = fVar288 * fStack_55c +
                        fVar311 * fVar284 + fVar316 * fVar468 + fVar308 * fStack_69c;
              fVar311 = fVar278 - (fVar283 + fVar283);
              fVar308 = fVar283 - (fVar278 + fVar278);
              fVar288 = fVar283 * local_568 +
                        fVar311 * fVar478 + fVar308 * fVar287 + (float)local_6a8._0_4_ * fVar278;
              fVar289 = fVar283 * fStack_564 +
                        fVar311 * fVar277 + fVar308 * fVar451 + (float)local_6a8._4_4_ * fVar278;
              fVar337 = fVar283 * fStack_560 +
                        fVar311 * fVar281 + fVar308 * fVar464 + fStack_6a0 * fVar278;
              fVar308 = (fVar279 * fVar206 + 0.0) - local_578;
              fVar311 = (fVar279 * fVar275 + 0.0) - fStack_574;
              fVar316 = (fVar279 * fVar314 + 0.0) - fStack_570;
              fVar341 = (fVar279 * 0.0 + 0.0) - fStack_56c;
              fVar283 = fVar311 * fVar311;
              fStack_5d0 = fVar316 * fVar316;
              fStack_5cc = fVar341 * fVar341;
              local_5d8._0_4_ = fVar283 + fVar308 * fVar308 + fStack_5d0;
              local_5d8._4_4_ = fVar283 + fVar283 + fStack_5cc;
              fStack_5d0 = fVar283 + fStack_5d0 + fStack_5d0;
              fStack_5cc = fVar283 + fStack_5cc + fStack_5cc;
              fVar283 = fVar285;
              if (fVar285 <= fVar286) {
                fVar283 = fVar286;
              }
              fVar309 = fVar306 * fVar306 + fVar339 * fVar339 + fVar307 * fVar307;
              auVar291 = ZEXT416((uint)fVar309);
              auVar356 = rsqrtss(ZEXT416((uint)fVar309),auVar291);
              fVar286 = auVar356._0_4_;
              fVar310 = fVar286 * 1.5 - fVar286 * fVar286 * fVar309 * 0.5 * fVar286;
              fVar313 = fVar339 * fVar310;
              fVar385 = fVar306 * fVar310;
              fVar353 = fVar307 * fVar310;
              fVar315 = fVar340 * fVar310;
              fVar391 = fVar337 * fVar307 + fVar289 * fVar306 + fVar288 * fVar339;
              auVar356 = rcpss(auVar291,auVar291);
              fVar286 = (2.0 - fVar309 * auVar356._0_4_) * auVar356._0_4_;
              fVar351 = fVar311 * fVar385;
              fVar372 = fVar316 * fVar353;
              fVar312 = fVar341 * fVar315;
              fVar388 = fVar351 + fVar308 * fVar313 + fVar372;
              fVar354 = fVar351 + fVar351 + fVar312;
              fVar372 = fVar351 + fVar372 + fVar372;
              fVar312 = fVar351 + fVar312 + fVar312;
              fVar394 = (SQRT((float)local_5d8._0_4_) + 1.0) * (fVar285 / SQRT(fVar309)) +
                        SQRT((float)local_5d8._0_4_) * fVar285 + fVar283;
              fVar351 = fVar315 * -fVar340;
              fVar289 = fVar353 * -fVar307 + fVar385 * -fVar306 + fVar313 * -fVar339 +
                        fVar286 * (fVar309 * fVar337 - fVar391 * fVar307) * fVar310 * fVar316 +
                        fVar286 * (fVar309 * fVar289 - fVar391 * fVar306) * fVar310 * fVar311 +
                        fVar286 * (fVar309 * fVar288 - fVar391 * fVar339) * fVar310 * fVar308;
              fVar309 = fVar314 * fVar353 + fVar275 * fVar385 + fVar206 * fVar313;
              fVar286 = (float)local_5d8._0_4_ - fVar388 * fVar388;
              auVar195._0_8_ = CONCAT44((float)local_5d8._4_4_ - fVar354 * fVar354,fVar286);
              auVar195._8_4_ = fStack_5d0 - fVar372 * fVar372;
              auVar195._12_4_ = fStack_5cc - fVar312 * fVar312;
              fVar337 = -fVar340 * fVar341;
              auVar252._8_4_ = auVar195._8_4_;
              auVar252._0_8_ = auVar195._0_8_;
              auVar252._12_4_ = auVar195._12_4_;
              auVar356 = rsqrtss(auVar252,auVar195);
              fVar288 = auVar356._0_4_;
              fVar288 = fVar288 * 1.5 - fVar288 * fVar288 * fVar286 * 0.5 * fVar288;
              if (fVar286 < 0.0) {
                fVar286 = sqrtf(fVar286);
                lVar135 = extraout_RAX_00;
                uVar138 = extraout_RDX_01;
              }
              else {
                fVar286 = SQRT(fVar286);
              }
              fVar286 = fVar286 - fStack_56c;
              fVar310 = ((-fVar307 * fVar316 + -fVar306 * fVar311 + -fVar339 * fVar308) -
                        fVar388 * fVar289) * fVar288 - fVar340;
              fVar288 = ((fVar314 * fVar316 + fVar275 * fVar311 + fVar206 * fVar308) -
                        fVar388 * fVar309) * fVar288;
              auVar425._0_8_ = CONCAT44(fVar337,fVar310) ^ 0x8000000080000000;
              auVar334._4_4_ = fVar351;
              auVar334._0_4_ = fVar289;
              auVar302._0_4_ = fVar289 * fVar288 - fVar309 * fVar310;
              auVar425._8_4_ = -fVar337;
              auVar425._12_4_ = fVar341 * 0.0;
              auVar424._8_8_ = auVar425._8_8_;
              auVar424._0_8_ = CONCAT44(fVar288,fVar310) ^ 0x80000000;
              auVar302._4_4_ = auVar302._0_4_;
              auVar302._8_4_ = auVar302._0_4_;
              auVar302._12_4_ = auVar302._0_4_;
              auVar291 = divps(auVar424,auVar302);
              auVar334._8_4_ = fVar351;
              auVar334._12_4_ = -(fVar315 * 0.0);
              auVar333._8_8_ = auVar334._8_8_;
              auVar333._0_8_ = CONCAT44(fVar309,fVar289) ^ 0x8000000000000000;
              auVar356 = divps(auVar333,auVar302);
              fVar279 = fVar279 - (fVar286 * auVar356._0_4_ + fVar388 * auVar291._0_4_);
              fVar278 = fVar278 - (fVar286 * auVar356._4_4_ + fVar388 * auVar291._4_4_);
              if ((ABS(fVar388) < fVar394) &&
                 (ABS(fVar286) < auVar405._12_4_ * 1.9073486e-06 + fVar283 + fVar394)) {
                bVar142 = uVar140 < 5;
                fVar279 = fVar467 + fVar279;
                if ((fVar279 < fVar280) ||
                   (fVar285 = *(float *)(ray + k * 4 + 0x80), fVar285 < fVar279)) {
                  lVar135 = 0;
                }
                else {
                  lVar135 = 0;
                  if ((0.0 <= fVar278) && (fVar278 <= 1.0)) {
                    auVar356 = rsqrtss(_local_5d8,_local_5d8);
                    fVar283 = auVar356._0_4_;
                    pGVar27 = (context->scene->geometries).items[uVar139].ptr;
                    if ((pGVar27->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                      lVar135 = 0;
                      pRVar136 = (RTCIntersectArguments *)context;
                      uVar138 = uVar139;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (lVar135 = CONCAT71((int7)((ulong)context->args >> 8),1),
                            pRVar136 = (RTCIntersectArguments *)context, uVar138 = uVar139,
                            pGVar27->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      fVar283 = fVar283 * 1.5 +
                                fVar283 * fVar283 * (float)local_5d8._0_4_ * -0.5 * fVar283;
                      fVar308 = fVar308 * fVar283;
                      fVar311 = fVar311 * fVar283;
                      fVar316 = fVar316 * fVar283;
                      fVar283 = fVar340 * fVar308 + fVar339;
                      fVar286 = fVar340 * fVar311 + fVar306;
                      fVar288 = fVar340 * fVar316 + fVar307;
                      fVar289 = fVar311 * fVar339 - fVar306 * fVar308;
                      fVar311 = fVar316 * fVar306 - fVar307 * fVar311;
                      fVar308 = fVar308 * fVar307 - fVar339 * fVar316;
                      local_2f8 = fVar311 * fVar286 - fVar308 * fVar283;
                      local_318._4_4_ = fVar308 * fVar288 - fVar289 * fVar286;
                      local_308 = fVar289 * fVar283 - fVar311 * fVar288;
                      local_318._0_4_ = local_318._4_4_;
                      fStack_310 = (float)local_318._4_4_;
                      fStack_30c = (float)local_318._4_4_;
                      fStack_304 = local_308;
                      fStack_300 = local_308;
                      fStack_2fc = local_308;
                      fStack_2f4 = local_2f8;
                      fStack_2f0 = local_2f8;
                      fStack_2ec = local_2f8;
                      local_2e8 = fVar278;
                      fStack_2e4 = fVar278;
                      fStack_2e0 = fVar278;
                      fStack_2dc = fVar278;
                      local_2d8 = 0;
                      uStack_2d4 = 0;
                      uStack_2d0 = 0;
                      uStack_2cc = 0;
                      local_2c8 = CONCAT44(uVar145,uVar145);
                      uStack_2c0 = CONCAT44(uVar145,uVar145);
                      local_2b8 = CONCAT44(uVar144,uVar144);
                      uStack_2b0 = CONCAT44(uVar144,uVar144);
                      local_2a8 = context->user->instID[0];
                      uStack_2a4 = local_2a8;
                      uStack_2a0 = local_2a8;
                      uStack_29c = local_2a8;
                      local_298 = context->user->instPrimID[0];
                      uStack_294 = local_298;
                      uStack_290 = local_298;
                      uStack_28c = local_298;
                      *(float *)(ray + k * 4 + 0x80) = fVar279;
                      local_5c8 = *(undefined1 (*) [16])
                                   (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                      args.valid = (int *)local_5c8;
                      args.geometryUserPtr = pGVar27->userPtr;
                      args.context = context->user;
                      args.ray = (RTCRayN *)ray;
                      args.hit = (RTCHitN *)local_318;
                      args.N = 4;
                      p_Var31 = pGVar27->occlusionFilterN;
                      auVar492._8_8_ = &local_2a8;
                      auVar492._0_8_ = p_Var31;
                      pRVar136 = (RTCIntersectArguments *)context;
                      if (p_Var31 != (RTCFilterFunctionN)0x0) {
                        auVar492 = (*p_Var31)(&args);
                      }
                      uVar138 = auVar492._8_8_;
                      auVar253._0_4_ = -(uint)(local_5c8._0_4_ == 0);
                      auVar253._4_4_ = -(uint)(local_5c8._4_4_ == 0);
                      auVar253._8_4_ = -(uint)(local_5c8._8_4_ == 0);
                      auVar253._12_4_ = -(uint)(local_5c8._12_4_ == 0);
                      uVar365 = movmskps(auVar492._0_4_,auVar253);
                      pRVar134 = (RTCRayN *)(ulong)(uVar365 ^ 0xf);
                      if ((uVar365 ^ 0xf) == 0) {
                        auVar253 = auVar253 ^ _DAT_01f46b70;
                      }
                      else {
                        pRVar136 = context->args;
                        if (((RTCIntersectArguments *)pRVar136->filter !=
                             (RTCIntersectArguments *)0x0) &&
                           ((((ulong)*(Scene **)&pRVar136->flags & 2) != 0 ||
                            (((pGVar27->field_8).field_0x2 & 0x40) != 0)))) {
                          (*(code *)pRVar136->filter)(&args);
                          uVar138 = extraout_RDX_02;
                        }
                        auVar196._0_4_ = -(uint)(local_5c8._0_4_ == 0);
                        auVar196._4_4_ = -(uint)(local_5c8._4_4_ == 0);
                        auVar196._8_4_ = -(uint)(local_5c8._8_4_ == 0);
                        auVar196._12_4_ = -(uint)(local_5c8._12_4_ == 0);
                        auVar253 = auVar196 ^ _DAT_01f46b70;
                        *(undefined1 (*) [16])(args.ray + 0x80) =
                             ~auVar196 & _DAT_01f45a40 |
                             *(undefined1 (*) [16])(args.ray + 0x80) & auVar196;
                        pRVar134 = args.ray;
                      }
                      auVar254._0_4_ = auVar253._0_4_ << 0x1f;
                      auVar254._4_4_ = auVar253._4_4_ << 0x1f;
                      auVar254._8_4_ = auVar253._8_4_ << 0x1f;
                      auVar254._12_4_ = auVar253._12_4_ << 0x1f;
                      iVar259 = movmskps((int)pRVar134,auVar254);
                      lVar135 = CONCAT71((int7)(CONCAT44((int)((ulong)pRVar134 >> 0x20),iVar259) >>
                                               8),iVar259 != 0);
                      if (iVar259 == 0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar285;
                      }
                    }
                  }
                }
                goto LAB_00380559;
              }
            }
            bVar142 = false;
LAB_00380559:
            bVar141 = bVar141 | bVar142 & (byte)lVar135;
            fVar447 = *(float *)(ray + k * 4 + 0x80);
            auVar193._0_4_ = -(uint)(fVar490 <= fVar447) & local_338._0_4_;
            auVar193._4_4_ = -(uint)(fVar209 <= fVar447) & local_338._4_4_;
            auVar193._8_4_ = -(uint)(fVar214 <= fVar447) & local_338._8_4_;
            auVar193._12_4_ = -(uint)(fVar262 <= fVar447) & local_338._12_4_;
          }
          auVar348._0_4_ =
               local_5b8._0_4_ & auVar347._0_4_ & -(uint)(local_598 + fVar207 <= fVar447);
          auVar348._4_4_ =
               local_5b8._4_4_ & auVar347._4_4_ & -(uint)(fStack_594 + fVar263 <= fVar447);
          auVar348._8_4_ =
               (uint)fStack_5b0 & auVar347._8_4_ & -(uint)(fStack_590 + fVar282 <= fVar447);
          auVar348._12_4_ =
               (uint)fStack_5ac & auVar347._12_4_ & -(uint)(fStack_58c + fVar489 <= fVar447);
          auVar303._0_4_ =
               auVar192._0_4_ & local_5a8._0_4_ &
               -(uint)(local_598 + tp1.lower.field_0.v[0] <= fVar447);
          auVar303._4_4_ =
               auVar192._4_4_ & local_5a8._4_4_ &
               -(uint)(fStack_594 + tp1.lower.field_0.v[1] <= fVar447);
          auVar303._8_4_ =
               auVar192._8_4_ & (uint)fStack_5a0 &
               -(uint)(fStack_590 + tp1.lower.field_0.v[2] <= fVar447);
          auVar303._12_4_ =
               auVar192._12_4_ & (uint)fStack_59c &
               -(uint)(fStack_58c + tp1.lower.field_0.v[3] <= fVar447);
          iVar259 = movmskps(0,auVar303 | auVar348);
          pRVar137 = pRVar136;
          if (iVar259 != 0) {
            stack[uVar146].valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar303 | auVar348);
            stack[uVar146].tlower.field_0.i[0] =
                 ~auVar348._0_4_ & tp1.lower.field_0.i[0] | (uint)fVar207 & auVar348._0_4_;
            stack[uVar146].tlower.field_0.i[1] =
                 ~auVar348._4_4_ & tp1.lower.field_0.i[1] | (uint)fVar263 & auVar348._4_4_;
            stack[uVar146].tlower.field_0.i[2] =
                 ~auVar348._8_4_ & tp1.lower.field_0.i[2] | (uint)fVar282 & auVar348._8_4_;
            stack[uVar146].tlower.field_0.i[3] =
                 ~auVar348._12_4_ & tp1.lower.field_0.i[3] | (uint)fVar489 & auVar348._12_4_;
            stack[uVar146].u0 = fVar364;
            stack[uVar146].u1 = fVar336;
            stack[uVar146].depth = uVar355 + 1;
            uVar146 = uVar146 + 1;
          }
        }
      }
    }
    do {
      uVar365 = uVar146;
      if (uVar365 == 0) {
        if (bVar141 != 0) goto LAB_00380b47;
        fVar206 = *(float *)(ray + k * 4 + 0x80);
        auVar258._4_4_ = -(uint)(fVar260 <= fVar206);
        auVar258._0_4_ = -(uint)(fVar150 <= fVar206);
        auVar258._8_4_ = -(uint)(fVar203 <= fVar206);
        auVar258._12_4_ = -(uint)(fVar261 <= fVar206);
        uVar144 = movmskps((int)pRVar137,auVar258);
        uVar143 = uVar143 - 1 & uVar143 & uVar144;
        goto LAB_0037e185;
      }
      uVar146 = uVar365 - 1;
      pRVar137 = (RTCIntersectArguments *)(ulong)uVar146;
      fVar336 = stack[(long)pRVar137].tlower.field_0.v[0];
      fVar489 = stack[(long)pRVar137].tlower.field_0.v[1];
      fVar490 = stack[(long)pRVar137].tlower.field_0.v[2];
      fVar207 = stack[(long)pRVar137].tlower.field_0.v[3];
      fVar364 = *(float *)(ray + k * 4 + 0x80);
      aVar197._0_4_ =
           -(uint)(local_598 + fVar336 <= fVar364) & stack[(long)pRVar137].valid.field_0.i[0];
      aVar197._4_4_ =
           -(uint)(fStack_594 + fVar489 <= fVar364) & stack[(long)pRVar137].valid.field_0.i[1];
      aVar197.i[2] = -(uint)(fStack_590 + fVar490 <= fVar364) &
                     stack[(long)pRVar137].valid.field_0.i[2];
      aVar197.i[3] = -(uint)(fStack_58c + fVar207 <= fVar364) &
                     stack[(long)pRVar137].valid.field_0.i[3];
      _local_318 = aVar197;
      uVar366 = movmskps((int)uVar138,(undefined1  [16])aVar197);
      uVar138 = (ulong)uVar366;
    } while (uVar366 == 0);
    auVar255._0_4_ = (uint)fVar336 & aVar197._0_4_;
    auVar255._4_4_ = (uint)fVar489 & aVar197._4_4_;
    auVar255._8_4_ = (uint)fVar490 & aVar197.i[2];
    auVar255._12_4_ = (uint)fVar207 & aVar197.i[3];
    auVar274._0_8_ = CONCAT44(~aVar197._4_4_,~aVar197._0_4_) & 0x7f8000007f800000;
    auVar274._8_4_ = ~aVar197.i[2] & 0x7f800000;
    auVar274._12_4_ = ~aVar197.i[3] & 0x7f800000;
    auVar274 = auVar274 | auVar255;
    auVar304._4_4_ = auVar274._0_4_;
    auVar304._0_4_ = auVar274._4_4_;
    auVar304._8_4_ = auVar274._12_4_;
    auVar304._12_4_ = auVar274._8_4_;
    auVar356 = minps(auVar304,auVar274);
    auVar256._0_8_ = auVar356._8_8_;
    auVar256._8_4_ = auVar356._0_4_;
    auVar256._12_4_ = auVar356._4_4_;
    auVar356 = minps(auVar256,auVar356);
    auVar257._0_8_ =
         CONCAT44(-(uint)(auVar356._4_4_ == auVar274._4_4_) & aVar197._4_4_,
                  -(uint)(auVar356._0_4_ == auVar274._0_4_) & aVar197._0_4_);
    auVar257._8_4_ = -(uint)(auVar356._8_4_ == auVar274._8_4_) & aVar197.i[2];
    auVar257._12_4_ = -(uint)(auVar356._12_4_ == auVar274._12_4_) & aVar197.i[3];
    iVar259 = movmskps(uVar146,auVar257);
    if (iVar259 != 0) {
      aVar197.i[2] = auVar257._8_4_;
      aVar197._0_8_ = auVar257._0_8_;
      aVar197.i[3] = auVar257._12_4_;
    }
    pSVar133 = stack + (long)pRVar137;
    uVar146 = movmskps(iVar259,(undefined1  [16])aVar197);
    pRVar136 = (RTCIntersectArguments *)0x0;
    if (uVar146 != 0) {
      for (; (uVar146 >> (long)pRVar136 & 1) == 0;
          pRVar136 = (RTCIntersectArguments *)((long)&pRVar136->flags + 1)) {
      }
    }
    *(undefined4 *)(local_318 + (long)pRVar136 * 4) = 0;
    uVar9 = stack[(long)pRVar137].u0;
    uVar19 = stack[(long)pRVar137].u1;
    uVar355 = stack[(long)pRVar137].depth;
    iVar259 = movmskps(uVar366,(undefined1  [16])_local_318);
    uVar146 = uVar365 - 1;
    if (iVar259 != 0) {
      uVar146 = uVar365;
    }
    uVar138 = (ulong)uVar146;
    (pSVar133->valid).field_0 = _local_318;
    fVar364 = (float)uVar19 - (float)uVar9;
    args.valid = (int *)CONCAT44(fVar364 * 0.33333334 + (float)uVar9,fVar364 * 0.0 + (float)uVar9);
    args.geometryUserPtr =
         (void *)CONCAT44(fVar364 * 1.0 + (float)uVar9,fVar364 * 0.6666667 + (float)uVar9);
    fVar364 = *(float *)((long)&args.valid + (long)pRVar136 * 4);
    fVar336 = *(float *)((long)&args.valid + (long)pRVar136 * 4 + 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }